

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx512::ConeCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  byte bVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  ulong uVar89;
  byte bVar90;
  byte bVar91;
  uint uVar92;
  uint uVar93;
  undefined1 auVar94 [8];
  uint uVar95;
  byte bVar96;
  ulong uVar97;
  ulong uVar98;
  byte bVar99;
  ulong uVar100;
  ulong uVar101;
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar168;
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined4 uVar181;
  undefined1 auVar182 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  RayQueryContext *local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  uint local_580 [4];
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  uint local_500 [4];
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint local_4e0 [4];
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  RTCHitN local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  int iVar102;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  undefined1 auVar183 [64];
  
  pSVar10 = context->scene;
  pGVar11 = (pSVar10->geometries).items[line->sharedGeomID].ptr;
  uVar92 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar93 = (line->v0).field_0.i[1];
  uVar95 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[4];
  auVar116._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar116._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar92 * (long)p_Var13);
  uVar7 = (line->v0).field_0.i[5];
  auVar134._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar134._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar93 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar112._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar112._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar95 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar113._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar113._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar127._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar92 + 1) * (long)p_Var13);
  auVar127._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar156._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar93 + 1) * (long)p_Var13);
  auVar156._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar158._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar95 + 1) * (long)p_Var13);
  auVar158._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  auVar103 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar160._0_16_ =
       ZEXT116(0) * auVar103 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar160._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
  local_100 = vpbroadcastd_avx512vl();
  auVar109 = vunpcklps_avx(auVar116,auVar112);
  auVar107 = vunpckhps_avx(auVar116,auVar112);
  auVar116 = vunpcklps_avx(auVar134,auVar113);
  auVar108 = vunpckhps_avx(auVar134,auVar113);
  auVar112 = vunpcklps_avx(auVar109,auVar116);
  auVar116 = vunpckhps_avx(auVar109,auVar116);
  auVar113 = vunpcklps_avx(auVar107,auVar108);
  auVar134 = vunpckhps_avx(auVar107,auVar108);
  auVar109 = vpunpckldq_avx2(auVar127,auVar158);
  auVar107 = vpunpckhdq_avx2(auVar127,auVar158);
  auVar127 = vpunpckldq_avx2(auVar156,auVar160);
  auVar108 = vpunpckhdq_avx2(auVar156,auVar160);
  auVar158 = vpunpckldq_avx2(auVar109,auVar127);
  auVar127 = vpunpckhdq_avx2(auVar109,auVar127);
  auVar160 = vpunpckldq_avx2(auVar107,auVar108);
  auVar156 = vpunpckhdq_avx2(auVar107,auVar108);
  auVar107 = vpcmpeqd_avx2(auVar109,auVar109);
  uVar89 = vpcmpd_avx512vl(auVar107,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar111._4_4_ = fVar1;
  auVar111._0_4_ = fVar1;
  auVar111._8_4_ = fVar1;
  auVar111._12_4_ = fVar1;
  auVar111._16_4_ = fVar1;
  auVar111._20_4_ = fVar1;
  auVar111._24_4_ = fVar1;
  auVar111._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar114._4_4_ = fVar2;
  auVar114._0_4_ = fVar2;
  auVar114._8_4_ = fVar2;
  auVar114._12_4_ = fVar2;
  auVar114._16_4_ = fVar2;
  auVar114._20_4_ = fVar2;
  auVar114._24_4_ = fVar2;
  auVar114._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  auVar115._4_4_ = fVar3;
  auVar115._0_4_ = fVar3;
  auVar115._8_4_ = fVar3;
  auVar115._12_4_ = fVar3;
  auVar115._16_4_ = fVar3;
  auVar115._20_4_ = fVar3;
  auVar115._24_4_ = fVar3;
  auVar115._28_4_ = fVar3;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar192 = ZEXT3264(auVar104);
  auVar105 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar193 = ZEXT3264(auVar105);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar194 = ZEXT3264(auVar106);
  auVar103 = vmulss_avx512f(auVar106._0_16_,auVar106._0_16_);
  auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar105,auVar105);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
  auVar109._0_4_ = auVar107._0_4_;
  auVar109._4_4_ = auVar109._0_4_;
  auVar109._8_4_ = auVar109._0_4_;
  auVar109._12_4_ = auVar109._0_4_;
  auVar109._16_4_ = auVar109._0_4_;
  auVar109._20_4_ = auVar109._0_4_;
  auVar109._24_4_ = auVar109._0_4_;
  auVar109._28_4_ = auVar109._0_4_;
  auVar108 = vrcp14ps_avx512vl(auVar109);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = 0x3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar107);
  auVar103 = vfmadd132ps_fma(auVar107,auVar108,auVar108);
  auVar110._0_4_ = auVar112._0_4_ + auVar158._0_4_;
  auVar110._4_4_ = auVar112._4_4_ + auVar158._4_4_;
  auVar110._8_4_ = auVar112._8_4_ + auVar158._8_4_;
  auVar110._12_4_ = auVar112._12_4_ + auVar158._12_4_;
  auVar110._16_4_ = auVar112._16_4_ + auVar158._16_4_;
  auVar110._20_4_ = auVar112._20_4_ + auVar158._20_4_;
  auVar110._24_4_ = auVar112._24_4_ + auVar158._24_4_;
  auVar110._28_4_ = auVar112._28_4_ + auVar158._28_4_;
  auVar117._0_4_ = auVar127._0_4_ + auVar116._0_4_;
  auVar117._4_4_ = auVar127._4_4_ + auVar116._4_4_;
  auVar117._8_4_ = auVar127._8_4_ + auVar116._8_4_;
  auVar117._12_4_ = auVar127._12_4_ + auVar116._12_4_;
  auVar117._16_4_ = auVar127._16_4_ + auVar116._16_4_;
  auVar117._20_4_ = auVar127._20_4_ + auVar116._20_4_;
  auVar117._24_4_ = auVar127._24_4_ + auVar116._24_4_;
  auVar117._28_4_ = auVar127._28_4_ + auVar116._28_4_;
  auVar118._0_4_ = auVar113._0_4_ + auVar160._0_4_;
  auVar118._4_4_ = auVar113._4_4_ + auVar160._4_4_;
  auVar118._8_4_ = auVar113._8_4_ + auVar160._8_4_;
  auVar118._12_4_ = auVar113._12_4_ + auVar160._12_4_;
  auVar118._16_4_ = auVar113._16_4_ + auVar160._16_4_;
  auVar118._20_4_ = auVar113._20_4_ + auVar160._20_4_;
  auVar118._24_4_ = auVar113._24_4_ + auVar160._24_4_;
  auVar118._28_4_ = auVar113._28_4_ + auVar160._28_4_;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar108 = vmulps_avx512vl(auVar110,auVar107);
  auVar109 = vmulps_avx512vl(auVar117,auVar107);
  auVar110 = vmulps_avx512vl(auVar118,auVar107);
  auVar107 = vsubps_avx(auVar108,auVar111);
  auVar108 = vsubps_avx(auVar109,auVar114);
  auVar109 = vsubps_avx(auVar110,auVar115);
  auVar109 = vmulps_avx512vl(auVar109,auVar106);
  auVar108 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar108);
  auVar107 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar107);
  auVar144._0_4_ = auVar107._0_4_ * auVar103._0_4_;
  auVar144._4_4_ = auVar107._4_4_ * auVar103._4_4_;
  auVar144._8_4_ = auVar107._8_4_ * auVar103._8_4_;
  auVar144._12_4_ = auVar107._12_4_ * auVar103._12_4_;
  auVar144._16_4_ = auVar107._16_4_ * 0.0;
  auVar144._20_4_ = auVar107._20_4_ * 0.0;
  auVar144._24_4_ = auVar107._24_4_ * 0.0;
  auVar144._28_4_ = 0;
  auVar107 = vmulps_avx512vl(auVar104,auVar144);
  auVar108 = vmulps_avx512vl(auVar105,auVar144);
  auVar109 = vmulps_avx512vl(auVar106,auVar144);
  auVar121._0_4_ = auVar107._0_4_ + fVar1;
  auVar121._4_4_ = auVar107._4_4_ + fVar1;
  auVar121._8_4_ = auVar107._8_4_ + fVar1;
  auVar121._12_4_ = auVar107._12_4_ + fVar1;
  auVar121._16_4_ = auVar107._16_4_ + fVar1;
  auVar121._20_4_ = auVar107._20_4_ + fVar1;
  auVar121._24_4_ = auVar107._24_4_ + fVar1;
  auVar121._28_4_ = auVar107._28_4_ + fVar1;
  auVar122._0_4_ = auVar108._0_4_ + fVar2;
  auVar122._4_4_ = auVar108._4_4_ + fVar2;
  auVar122._8_4_ = auVar108._8_4_ + fVar2;
  auVar122._12_4_ = auVar108._12_4_ + fVar2;
  auVar122._16_4_ = auVar108._16_4_ + fVar2;
  auVar122._20_4_ = auVar108._20_4_ + fVar2;
  auVar122._24_4_ = auVar108._24_4_ + fVar2;
  auVar122._28_4_ = auVar108._28_4_ + fVar2;
  auVar123._0_4_ = fVar3 + auVar109._0_4_;
  auVar123._4_4_ = fVar3 + auVar109._4_4_;
  auVar123._8_4_ = fVar3 + auVar109._8_4_;
  auVar123._12_4_ = fVar3 + auVar109._12_4_;
  auVar123._16_4_ = fVar3 + auVar109._16_4_;
  auVar123._20_4_ = fVar3 + auVar109._20_4_;
  auVar123._24_4_ = fVar3 + auVar109._24_4_;
  auVar123._28_4_ = fVar3 + auVar109._28_4_;
  auVar109 = vsubps_avx512vl(auVar158,auVar112);
  auVar195 = ZEXT3264(auVar109);
  auVar110 = vsubps_avx512vl(auVar127,auVar116);
  auVar196 = ZEXT3264(auVar110);
  auVar111 = vsubps_avx512vl(auVar160,auVar113);
  auVar197 = ZEXT3264(auVar111);
  _local_660 = vsubps_avx512vl(auVar121,auVar112);
  _local_600 = vsubps_avx(auVar122,auVar116);
  auVar112 = vsubps_avx512vl(auVar123,auVar113);
  auVar200 = ZEXT3264(auVar112);
  auVar107 = vmulps_avx512vl(auVar111,auVar111);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar110);
  auVar113 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar109);
  auVar107 = vmulps_avx512vl(auVar111,auVar112);
  auVar107 = vfmadd231ps_avx512vl(auVar107,_local_600,auVar110);
  auVar114 = vfmadd231ps_avx512vl(auVar107,_local_660,auVar109);
  auVar107 = vmulps_avx512vl(auVar111,auVar106);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar110);
  auVar115 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar109);
  auVar107 = vsubps_avx(auVar134,auVar156);
  fVar1 = auVar107._0_4_;
  fVar3 = auVar107._4_4_;
  fVar62 = auVar107._8_4_;
  fVar65 = auVar107._12_4_;
  fVar68 = auVar107._16_4_;
  fVar71 = auVar107._20_4_;
  fVar74 = auVar107._24_4_;
  auVar150._0_4_ = fVar1 * fVar1 + auVar113._0_4_;
  auVar150._4_4_ = fVar3 * fVar3 + auVar113._4_4_;
  auVar150._8_4_ = fVar62 * fVar62 + auVar113._8_4_;
  auVar150._12_4_ = fVar65 * fVar65 + auVar113._12_4_;
  auVar150._16_4_ = fVar68 * fVar68 + auVar113._16_4_;
  auVar150._20_4_ = fVar71 * fVar71 + auVar113._20_4_;
  auVar150._24_4_ = fVar74 * fVar74 + auVar113._24_4_;
  auVar150._28_4_ = auVar116._28_4_ + auVar113._28_4_;
  auVar108 = vmulps_avx512vl(auVar106,auVar112);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,_local_600);
  auVar116 = vfmadd231ps_avx512vl(auVar108,auVar104,_local_660);
  auVar108 = vmulps_avx512vl(auVar112,auVar112);
  auVar108 = vfmadd231ps_avx512vl(auVar108,_local_600,_local_600);
  auVar117 = vfmadd231ps_avx512vl(auVar108,_local_660,_local_660);
  auVar118 = vmulps_avx512vl(auVar113,auVar113);
  auVar201 = ZEXT3264(auVar118);
  auVar119 = vmulps_avx512vl(auVar134,auVar113);
  fVar2 = auVar115._0_4_;
  fVar169 = fVar2 * fVar2;
  fVar60 = auVar115._4_4_;
  fVar171 = fVar60 * fVar60;
  auVar108._4_4_ = fVar171;
  auVar108._0_4_ = fVar169;
  fVar63 = auVar115._8_4_;
  fVar172 = fVar63 * fVar63;
  auVar108._8_4_ = fVar172;
  fVar66 = auVar115._12_4_;
  fVar173 = fVar66 * fVar66;
  auVar108._12_4_ = fVar173;
  fVar69 = auVar115._16_4_;
  fVar174 = fVar69 * fVar69;
  auVar108._16_4_ = fVar174;
  fVar72 = auVar115._20_4_;
  fVar175 = fVar72 * fVar72;
  auVar108._20_4_ = fVar175;
  fVar75 = auVar115._24_4_;
  fVar176 = fVar75 * fVar75;
  auVar108._24_4_ = fVar176;
  auVar108._28_4_ = local_600._28_4_;
  auVar108 = vmulps_avx512vl(auVar150,auVar108);
  auVar108 = vsubps_avx512vl(auVar118,auVar108);
  auVar116 = vmulps_avx512vl(auVar118,auVar116);
  auVar120 = vmulps_avx512vl(auVar115,auVar114);
  auVar120 = vmulps_avx512vl(auVar150,auVar120);
  auVar116 = vsubps_avx512vl(auVar116,auVar120);
  auVar120 = vmulps_avx512vl(auVar107,auVar115);
  auVar120 = vmulps_avx512vl(auVar119,auVar120);
  auVar116 = vaddps_avx512vl(auVar120,auVar116);
  auVar117 = vmulps_avx512vl(auVar118,auVar117);
  auVar120 = vmulps_avx512vl(auVar114,auVar114);
  auVar120 = vmulps_avx512vl(auVar150,auVar120);
  auVar117 = vsubps_avx512vl(auVar117,auVar120);
  auVar107 = vaddps_avx512vl(auVar107,auVar107);
  auVar107 = vmulps_avx512vl(auVar107,auVar114);
  auVar107 = vsubps_avx512vl(auVar107,auVar119);
  auVar107 = vmulps_avx512vl(auVar119,auVar107);
  auVar107 = vaddps_avx512vl(auVar117,auVar107);
  auVar117 = vmulps_avx512vl(auVar116,auVar116);
  auVar107 = vmulps_avx512vl(auVar108,auVar107);
  auVar107 = vsubps_avx512vl(auVar117,auVar107);
  auVar117 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar101 = vcmpps_avx512vl(auVar107,auVar117,5);
  bVar91 = (byte)(uVar89 & uVar101);
  if (bVar91 != 0) {
    auVar158 = vsubps_avx(auVar121,auVar158);
    auVar127 = vsubps_avx(auVar122,auVar127);
    auVar160 = vsubps_avx(auVar123,auVar160);
    auVar121 = vsqrtps_avx512vl(auVar107);
    auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar107 = vrcp14ps_avx512vl(auVar108);
    auVar123 = vfnmadd213ps_avx512vl(auVar107,auVar108,auVar122);
    auVar119._8_4_ = 0x7fffffff;
    auVar119._0_8_ = 0x7fffffff7fffffff;
    auVar119._12_4_ = 0x7fffffff;
    auVar119._16_4_ = 0x7fffffff;
    auVar119._20_4_ = 0x7fffffff;
    auVar119._24_4_ = 0x7fffffff;
    auVar119._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar108,auVar119);
    auVar120._8_4_ = 0x219392ef;
    auVar120._0_8_ = 0x219392ef219392ef;
    auVar120._12_4_ = 0x219392ef;
    auVar120._16_4_ = 0x219392ef;
    auVar120._20_4_ = 0x219392ef;
    auVar120._24_4_ = 0x219392ef;
    auVar120._28_4_ = 0x219392ef;
    uVar97 = vcmpps_avx512vl(auVar123,auVar120,2);
    auVar108 = vfmadd132ps_avx512vl(auVar123,auVar107,auVar107);
    auVar157._8_4_ = 0x80000000;
    auVar157._0_8_ = 0x8000000080000000;
    auVar157._12_4_ = 0x80000000;
    auVar157._16_4_ = 0x80000000;
    auVar157._20_4_ = 0x80000000;
    auVar157._24_4_ = 0x80000000;
    auVar157._28_4_ = 0x80000000;
    auVar107 = vxorps_avx512vl(auVar116,auVar157);
    auVar107 = vsubps_avx(auVar107,auVar121);
    auVar107 = vmulps_avx512vl(auVar107,auVar108);
    auVar179._8_4_ = 0xff800000;
    auVar179._0_8_ = 0xff800000ff800000;
    auVar179._12_4_ = 0xff800000;
    auVar179._16_4_ = 0xff800000;
    auVar179._20_4_ = 0xff800000;
    auVar179._24_4_ = 0xff800000;
    auVar179._28_4_ = 0xff800000;
    bVar14 = (bool)((byte)uVar97 & 1);
    auVar124._0_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._0_4_;
    bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
    auVar124._4_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._4_4_;
    bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
    auVar124._8_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._8_4_;
    bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
    auVar124._12_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._12_4_;
    bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
    auVar124._16_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._16_4_;
    bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
    auVar124._20_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._20_4_;
    bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
    auVar124._24_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._24_4_;
    bVar14 = SUB81(uVar97 >> 7,0);
    auVar124._28_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar107._28_4_;
    auVar107 = vsubps_avx512vl(auVar121,auVar116);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar191 = ZEXT3264(auVar119);
    auVar107 = vmulps_avx512vl(auVar107,auVar108);
    bVar14 = (bool)((byte)uVar97 & 1);
    iVar102 = auVar119._0_4_;
    auVar125._0_4_ = (uint)bVar14 * iVar102 | (uint)!bVar14 * auVar107._0_4_;
    bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
    iVar137 = auVar119._4_4_;
    auVar125._4_4_ = (uint)bVar14 * iVar137 | (uint)!bVar14 * auVar107._4_4_;
    bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
    iVar138 = auVar119._8_4_;
    auVar125._8_4_ = (uint)bVar14 * iVar138 | (uint)!bVar14 * auVar107._8_4_;
    bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
    iVar139 = auVar119._12_4_;
    auVar125._12_4_ = (uint)bVar14 * iVar139 | (uint)!bVar14 * auVar107._12_4_;
    bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
    iVar140 = auVar119._16_4_;
    auVar125._16_4_ = (uint)bVar14 * iVar140 | (uint)!bVar14 * auVar107._16_4_;
    bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
    iVar141 = auVar119._20_4_;
    auVar125._20_4_ = (uint)bVar14 * iVar141 | (uint)!bVar14 * auVar107._20_4_;
    bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
    iVar142 = auVar119._24_4_;
    iVar143 = auVar119._28_4_;
    auVar125._24_4_ = (uint)bVar14 * iVar142 | (uint)!bVar14 * auVar107._24_4_;
    bVar14 = SUB81(uVar97 >> 7,0);
    auVar125._28_4_ = (uint)bVar14 * iVar143 | (uint)!bVar14 * auVar107._28_4_;
    auVar107 = vmulps_avx512vl(auVar115,auVar124);
    auVar177._0_4_ = auVar114._0_4_ + auVar107._0_4_;
    auVar177._4_4_ = auVar114._4_4_ + auVar107._4_4_;
    auVar177._8_4_ = auVar114._8_4_ + auVar107._8_4_;
    auVar177._12_4_ = auVar114._12_4_ + auVar107._12_4_;
    auVar177._16_4_ = auVar114._16_4_ + auVar107._16_4_;
    auVar177._20_4_ = auVar114._20_4_ + auVar107._20_4_;
    auVar177._24_4_ = auVar114._24_4_ + auVar107._24_4_;
    fVar168 = auVar114._28_4_;
    auVar177._28_4_ = fVar168 + auVar107._28_4_;
    auVar107 = vmulps_avx512vl(auVar115,auVar125);
    auVar120 = vaddps_avx512vl(auVar114,auVar107);
    auVar198 = ZEXT3264(auVar120);
    uVar77 = vcmpps_avx512vl(auVar177,auVar113,1);
    uVar78 = vcmpps_avx512vl(auVar177,auVar117,6);
    uVar79 = vcmpps_avx512vl(auVar120,auVar113,1);
    uVar80 = vcmpps_avx512vl(auVar120,auVar117,6);
    auVar170._0_4_ = fVar2 * (float)local_660._0_4_;
    auVar170._4_4_ = fVar60 * (float)local_660._4_4_;
    auVar170._8_4_ = fVar63 * fStack_658;
    auVar170._12_4_ = fVar66 * fStack_654;
    auVar170._16_4_ = fVar69 * fStack_650;
    auVar170._20_4_ = fVar72 * fStack_64c;
    auVar170._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar170._24_4_ = fVar75 * fStack_648;
    auVar107 = vmulps_avx512vl(auVar115,_local_600);
    auVar108 = vmulps_avx512vl(auVar115,auVar112);
    auVar116 = vmulps_avx512vl(auVar104,auVar114);
    auVar116 = vsubps_avx512vl(auVar170._0_32_,auVar116);
    auVar117 = vmulps_avx512vl(auVar105,auVar114);
    auVar107 = vsubps_avx512vl(auVar107,auVar117);
    auVar117 = vmulps_avx512vl(auVar106,auVar114);
    auVar108 = vsubps_avx512vl(auVar108,auVar117);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,auVar116);
    fVar59 = auVar134._0_4_;
    fVar61 = auVar134._4_4_;
    fVar64 = auVar134._8_4_;
    fVar67 = auVar134._12_4_;
    fVar70 = auVar134._16_4_;
    fVar73 = auVar134._20_4_;
    fVar76 = auVar134._24_4_;
    auVar82._4_4_ = fVar61 * fVar61 * fVar171;
    auVar82._0_4_ = fVar59 * fVar59 * fVar169;
    auVar82._8_4_ = fVar64 * fVar64 * fVar172;
    auVar82._12_4_ = fVar67 * fVar67 * fVar173;
    auVar82._16_4_ = fVar70 * fVar70 * fVar174;
    auVar82._20_4_ = fVar73 * fVar73 * fVar175;
    auVar82._24_4_ = fVar76 * fVar76 * fVar176;
    auVar82._28_4_ = auVar116._28_4_;
    uVar97 = vcmpps_avx512vl(auVar107,auVar82,1);
    uVar97 = (bVar91 & ~(byte)line->leftExists) & uVar97;
    auVar107 = vrcp14ps_avx512vl(auVar115);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar115,auVar122);
    auVar117 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar163._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
    auVar163._8_4_ = -auVar114._8_4_;
    auVar163._12_4_ = -auVar114._12_4_;
    auVar163._16_4_ = -auVar114._16_4_;
    auVar163._20_4_ = -auVar114._20_4_;
    auVar163._24_4_ = -auVar114._24_4_;
    auVar163._28_4_ = -fVar168;
    auVar107 = vmulps_avx512vl(auVar117,auVar163);
    bVar14 = (bool)((byte)uVar97 & 1);
    auVar126._0_4_ = (uint)bVar14 * auVar107._0_4_ | (uint)!bVar14 * iVar102;
    bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
    auVar126._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * iVar137;
    bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
    auVar126._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * iVar138;
    bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
    auVar126._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * iVar139;
    bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * iVar140;
    bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * iVar141;
    bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * iVar142;
    bVar14 = SUB81(uVar97 >> 7,0);
    auVar126._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * iVar143;
    auVar190 = ZEXT3264(auVar126);
    auVar107 = vmulps_avx512vl(auVar111,auVar160);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar127,auVar110);
    auVar114 = vfmadd231ps_avx512vl(auVar107,auVar158,auVar109);
    auVar83._4_4_ = auVar158._4_4_ * fVar60;
    auVar83._0_4_ = auVar158._0_4_ * fVar2;
    auVar83._8_4_ = auVar158._8_4_ * fVar63;
    auVar83._12_4_ = auVar158._12_4_ * fVar66;
    auVar83._16_4_ = auVar158._16_4_ * fVar69;
    auVar83._20_4_ = auVar158._20_4_ * fVar72;
    auVar83._24_4_ = auVar158._24_4_ * fVar75;
    auVar83._28_4_ = fVar168;
    auVar84._4_4_ = auVar127._4_4_ * fVar60;
    auVar84._0_4_ = auVar127._0_4_ * fVar2;
    auVar84._8_4_ = auVar127._8_4_ * fVar63;
    auVar84._12_4_ = auVar127._12_4_ * fVar66;
    auVar84._16_4_ = auVar127._16_4_ * fVar69;
    auVar84._20_4_ = auVar127._20_4_ * fVar72;
    auVar84._24_4_ = auVar127._24_4_ * fVar75;
    auVar84._28_4_ = auVar158._28_4_;
    auVar85._4_4_ = auVar160._4_4_ * fVar60;
    auVar85._0_4_ = auVar160._0_4_ * fVar2;
    auVar85._8_4_ = auVar160._8_4_ * fVar63;
    auVar85._12_4_ = auVar160._12_4_ * fVar66;
    auVar85._16_4_ = auVar160._16_4_ * fVar69;
    auVar85._20_4_ = auVar160._20_4_ * fVar72;
    auVar85._24_4_ = auVar160._24_4_ * fVar75;
    auVar85._28_4_ = auVar115._28_4_;
    auVar107 = vmulps_avx512vl(auVar104,auVar114);
    auVar107 = vsubps_avx(auVar83,auVar107);
    auVar108 = vmulps_avx512vl(auVar105,auVar114);
    auVar108 = vsubps_avx(auVar84,auVar108);
    auVar127 = vmulps_avx512vl(auVar106,auVar114);
    auVar116 = vsubps_avx(auVar85,auVar127);
    auVar86._4_4_ = auVar116._4_4_ * auVar116._4_4_;
    auVar86._0_4_ = auVar116._0_4_ * auVar116._0_4_;
    auVar86._8_4_ = auVar116._8_4_ * auVar116._8_4_;
    auVar86._12_4_ = auVar116._12_4_ * auVar116._12_4_;
    auVar86._16_4_ = auVar116._16_4_ * auVar116._16_4_;
    auVar86._20_4_ = auVar116._20_4_ * auVar116._20_4_;
    auVar86._24_4_ = auVar116._24_4_ * auVar116._24_4_;
    auVar86._28_4_ = auVar116._28_4_;
    auVar103 = vfmadd231ps_fma(auVar86,auVar108,auVar108);
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar107,auVar107);
    auVar87._4_4_ = fVar171 * auVar156._4_4_ * auVar156._4_4_;
    auVar87._0_4_ = fVar169 * auVar156._0_4_ * auVar156._0_4_;
    auVar87._8_4_ = fVar172 * auVar156._8_4_ * auVar156._8_4_;
    auVar87._12_4_ = fVar173 * auVar156._12_4_ * auVar156._12_4_;
    auVar87._16_4_ = fVar174 * auVar156._16_4_ * auVar156._16_4_;
    auVar87._20_4_ = fVar175 * auVar156._20_4_ * auVar156._20_4_;
    auVar87._24_4_ = fVar176 * auVar156._24_4_ * auVar156._24_4_;
    auVar87._28_4_ = auVar156._28_4_;
    uVar181 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar166._4_4_ = uVar181;
    auVar166._0_4_ = uVar181;
    auVar166._8_4_ = uVar181;
    auVar166._12_4_ = uVar181;
    auVar166._16_4_ = uVar181;
    auVar166._20_4_ = uVar181;
    auVar166._24_4_ = uVar181;
    auVar166._28_4_ = uVar181;
    bVar99 = (byte)uVar77 & (byte)uVar78 & bVar91;
    auVar107 = vblendmps_avx512vl(auVar119,auVar124);
    auVar128._0_4_ =
         (uint)(bVar99 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar127._0_4_;
    bVar14 = (bool)(bVar99 >> 1 & 1);
    auVar128._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar127._4_4_;
    bVar14 = (bool)(bVar99 >> 2 & 1);
    auVar128._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar127._8_4_;
    bVar14 = (bool)(bVar99 >> 3 & 1);
    auVar128._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar127._12_4_;
    bVar14 = (bool)(bVar99 >> 4 & 1);
    auVar128._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar127._16_4_;
    bVar14 = (bool)(bVar99 >> 5 & 1);
    auVar128._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar127._20_4_;
    bVar14 = (bool)(bVar99 >> 6 & 1);
    auVar128._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar127._24_4_;
    auVar128._28_4_ =
         (uint)(bVar99 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar99 >> 7) * auVar127._28_4_;
    auVar184 = ZEXT3264(auVar128);
    bVar99 = (byte)uVar79 & (byte)uVar80 & bVar91;
    auVar107 = vblendmps_avx512vl(auVar179,auVar125);
    auVar129._0_4_ =
         (uint)(bVar99 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar99 & 1) * (int)auVar160._0_4_;
    bVar14 = (bool)(bVar99 >> 1 & 1);
    auVar129._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * (int)auVar160._4_4_;
    bVar14 = (bool)(bVar99 >> 2 & 1);
    auVar129._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * (int)auVar160._8_4_;
    bVar14 = (bool)(bVar99 >> 3 & 1);
    auVar129._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * (int)auVar160._12_4_;
    bVar14 = (bool)(bVar99 >> 4 & 1);
    auVar129._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * (int)auVar160._16_4_;
    bVar14 = (bool)(bVar99 >> 5 & 1);
    auVar129._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * (int)auVar160._20_4_;
    bVar14 = (bool)(bVar99 >> 6 & 1);
    auVar129._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * (int)auVar160._24_4_;
    auVar129._28_4_ =
         (uint)(bVar99 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar99 >> 7) * auVar160._28_4_;
    auVar185 = ZEXT3264(auVar129);
    auVar164._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
    auVar164._8_4_ = auVar114._8_4_ ^ 0x80000000;
    auVar164._12_4_ = auVar114._12_4_ ^ 0x80000000;
    auVar164._16_4_ = auVar114._16_4_ ^ 0x80000000;
    auVar164._20_4_ = auVar114._20_4_ ^ 0x80000000;
    auVar164._24_4_ = auVar114._24_4_ ^ 0x80000000;
    auVar164._28_4_ = auVar114._28_4_ ^ 0x80000000;
    uVar97 = vcmpps_avx512vl(ZEXT1632(auVar103),auVar87,1);
    uVar97 = (bVar91 & ~(byte)line->rightExists) & uVar97;
    auVar107 = vmulps_avx512vl(auVar117,auVar164);
    bVar14 = (bool)((byte)uVar97 & 1);
    auVar130._0_4_ = (uint)bVar14 * auVar107._0_4_ | (uint)!bVar14 * iVar102;
    bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * iVar137;
    bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * iVar138;
    bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * iVar139;
    bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * iVar140;
    bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * iVar141;
    bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * iVar142;
    bVar14 = SUB81(uVar97 >> 7,0);
    auVar130._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * iVar143;
    auVar108 = vminps_avx512vl(auVar126,auVar130);
    auVar116 = vmaxps_avx512vl(auVar126,auVar130);
    auVar107 = vminps_avx(auVar128,auVar108);
    uVar97 = vcmpps_avx512vl(auVar107,auVar108,0);
    uVar98 = vcmpps_avx512vl(auVar116,auVar119,0);
    bVar14 = (bool)((byte)uVar98 & 1);
    bVar17 = (bool)((byte)(uVar98 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar98 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar98 >> 3) & 1);
    bVar27 = (bool)((byte)(uVar98 >> 4) & 1);
    bVar36 = (bool)((byte)(uVar98 >> 5) & 1);
    bVar45 = (bool)((byte)(uVar98 >> 6) & 1);
    bVar54 = SUB81(uVar98 >> 7,0);
    uVar98 = vcmpps_avx512vl(auVar108,auVar119,0);
    bVar15 = (bool)((byte)uVar98 & 1);
    bVar18 = (bool)((byte)(uVar98 >> 1) & 1);
    bVar20 = (bool)((byte)(uVar98 >> 2) & 1);
    bVar22 = (bool)((byte)(uVar98 >> 3) & 1);
    bVar28 = (bool)((byte)(uVar98 >> 4) & 1);
    bVar37 = (bool)((byte)(uVar98 >> 5) & 1);
    bVar46 = (bool)((byte)(uVar98 >> 6) & 1);
    bVar55 = SUB81(uVar98 >> 7,0);
    bVar16 = (bool)((byte)uVar97 & 1);
    auVar131._0_4_ =
         (uint)bVar16 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar116._0_4_) |
         (uint)!bVar16 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar108._0_4_);
    bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
    auVar131._4_4_ =
         (uint)bVar14 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar116._4_4_) |
         (uint)!bVar14 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar108._4_4_);
    bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
    auVar131._8_4_ =
         (uint)bVar14 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar116._8_4_) |
         (uint)!bVar14 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar108._8_4_);
    bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
    auVar131._12_4_ =
         (uint)bVar14 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar116._12_4_) |
         (uint)!bVar14 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar108._12_4_);
    bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
    auVar131._16_4_ =
         (uint)bVar14 * ((uint)bVar27 * -0x800000 | (uint)!bVar27 * auVar116._16_4_) |
         (uint)!bVar14 * ((uint)bVar28 * -0x800000 | (uint)!bVar28 * auVar108._16_4_);
    bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
    auVar131._20_4_ =
         (uint)bVar14 * ((uint)bVar36 * -0x800000 | (uint)!bVar36 * auVar116._20_4_) |
         (uint)!bVar14 * ((uint)bVar37 * -0x800000 | (uint)!bVar37 * auVar108._20_4_);
    bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
    auVar131._24_4_ =
         (uint)bVar14 * ((uint)bVar45 * -0x800000 | (uint)!bVar45 * auVar116._24_4_) |
         (uint)!bVar14 * ((uint)bVar46 * -0x800000 | (uint)!bVar46 * auVar108._24_4_);
    bVar14 = SUB81(uVar97 >> 7,0);
    auVar131._28_4_ =
         (uint)bVar14 * ((uint)bVar54 * -0x800000 | (uint)!bVar54 * auVar116._28_4_) |
         (uint)!bVar14 * ((uint)bVar55 * -0x800000 | (uint)!bVar55 * auVar108._28_4_);
    auVar108 = vmaxps_avx512vl(auVar129,auVar131);
    auVar186 = ZEXT3264(auVar108);
    auVar161._0_4_ = auVar144._0_4_ + auVar107._0_4_;
    auVar161._4_4_ = auVar144._4_4_ + auVar107._4_4_;
    auVar161._8_4_ = auVar144._8_4_ + auVar107._8_4_;
    auVar161._12_4_ = auVar144._12_4_ + auVar107._12_4_;
    auVar161._16_4_ = auVar144._16_4_ + auVar107._16_4_;
    auVar161._20_4_ = auVar144._20_4_ + auVar107._20_4_;
    auVar161._24_4_ = auVar144._24_4_ + auVar107._24_4_;
    auVar161._28_4_ = auVar107._28_4_ + 0.0;
    uVar97 = vcmpps_avx512vl(auVar166,auVar161,2);
    uVar181 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar182._4_4_ = uVar181;
    auVar182._0_4_ = uVar181;
    auVar182._8_4_ = uVar181;
    auVar182._12_4_ = uVar181;
    auVar182._16_4_ = uVar181;
    auVar182._20_4_ = uVar181;
    auVar182._24_4_ = uVar181;
    auVar182._28_4_ = uVar181;
    auVar183 = ZEXT3264(auVar182);
    uVar98 = vcmpps_avx512vl(auVar161,auVar182,2);
    auVar116 = vaddps_avx512vl(auVar144,auVar108);
    auVar170 = ZEXT3264(auVar116);
    uVar77 = vcmpps_avx512vl(auVar166,auVar116,2);
    uVar78 = vcmpps_avx512vl(auVar116,auVar182,2);
    uVar79 = vcmpps_avx512vl(auVar108,auVar179,4);
    bVar96 = (byte)uVar77 & (byte)uVar78 & (byte)uVar79;
    uVar100 = vcmpps_avx512vl(auVar107,auVar119,4);
    uVar100 = uVar97 & uVar98 & uVar100;
    bVar99 = (byte)uVar100 & bVar91;
    bVar90 = bVar91 & ((byte)uVar100 | bVar96);
    uVar97 = (ulong)bVar90;
    if (bVar90 != 0) {
      auVar108 = vblendmps_avx512vl(auVar108,auVar107);
      auVar132._0_4_ =
           (float)((uint)(bVar99 & 1) * auVar108._0_4_ |
                  (uint)!(bool)(bVar99 & 1) * (int)auVar161._0_4_);
      bVar14 = (bool)(bVar99 >> 1 & 1);
      auVar132._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * (int)auVar161._4_4_);
      bVar14 = (bool)(bVar99 >> 2 & 1);
      auVar132._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * (int)auVar161._8_4_);
      bVar14 = (bool)(bVar99 >> 3 & 1);
      auVar132._12_4_ =
           (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * (int)auVar161._12_4_);
      bVar14 = (bool)(bVar99 >> 4 & 1);
      auVar132._16_4_ =
           (float)((uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * (int)auVar161._16_4_);
      bVar14 = (bool)(bVar99 >> 5 & 1);
      auVar132._20_4_ =
           (float)((uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * (int)auVar161._20_4_);
      bVar14 = (bool)(bVar99 >> 6 & 1);
      auVar132._24_4_ =
           (float)((uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * (int)auVar161._24_4_);
      auVar132._28_4_ =
           (float)((uint)(bVar99 >> 7) * auVar108._28_4_ |
                  (uint)!(bool)(bVar99 >> 7) * (int)auVar161._28_4_);
      auVar108 = vblendmps_avx512vl(auVar120,auVar177);
      auVar133._0_4_ =
           (float)((uint)(bVar99 & 1) * auVar108._0_4_ |
                  (uint)!(bool)(bVar99 & 1) * (int)auVar107._0_4_);
      bVar14 = (bool)(bVar99 >> 1 & 1);
      auVar133._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * (int)auVar107._4_4_);
      bVar14 = (bool)(bVar99 >> 2 & 1);
      auVar133._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * (int)auVar107._8_4_);
      bVar14 = (bool)(bVar99 >> 3 & 1);
      auVar133._12_4_ =
           (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * (int)auVar107._12_4_);
      bVar14 = (bool)(bVar99 >> 4 & 1);
      auVar133._16_4_ =
           (float)((uint)bVar14 * auVar108._16_4_ | (uint)!bVar14 * (int)auVar107._16_4_);
      bVar14 = (bool)(bVar99 >> 5 & 1);
      auVar133._20_4_ =
           (float)((uint)bVar14 * auVar108._20_4_ | (uint)!bVar14 * (int)auVar107._20_4_);
      bVar14 = (bool)(bVar99 >> 6 & 1);
      auVar133._24_4_ =
           (float)((uint)bVar14 * auVar108._24_4_ | (uint)!bVar14 * (int)auVar107._24_4_);
      auVar133._28_4_ =
           (uint)(bVar99 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar99 >> 7) * (int)auVar107._28_4_
      ;
      auVar107 = vrcp14ps_avx512vl(auVar113);
      auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar113,auVar122);
      auVar103 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
      auVar178 = ZEXT1664(auVar103);
      auVar88._4_4_ = fVar61 * fVar3 * auVar113._4_4_;
      auVar88._0_4_ = fVar59 * fVar1 * auVar113._0_4_;
      auVar88._8_4_ = fVar64 * fVar62 * auVar113._8_4_;
      auVar88._12_4_ = fVar67 * fVar65 * auVar113._12_4_;
      auVar88._16_4_ = fVar70 * fVar68 * auVar113._16_4_;
      auVar88._20_4_ = fVar73 * fVar71 * auVar113._20_4_;
      auVar88._24_4_ = fVar76 * fVar74 * auVar113._24_4_;
      auVar88._28_4_ = auVar134._28_4_;
      _local_80 = vmulps_avx512vl(auVar109,auVar88);
      auVar107 = vmulps_avx512vl(auVar110,auVar88);
      auVar187 = ZEXT3264(auVar107);
      auVar108 = vmulps_avx512vl(auVar109,auVar150);
      auVar188 = ZEXT3264(auVar108);
      auVar116 = vmulps_avx512vl(auVar110,auVar150);
      auVar199 = ZEXT3264(auVar116);
      uVar77 = vcmpps_avx512vl(auVar132,auVar128,0);
      uVar78 = vcmpps_avx512vl(auVar132,auVar129,0);
      bVar81 = ((byte)uVar77 | (byte)uVar78) & bVar91;
      uVar98 = vcmpps_avx512vl(auVar132,auVar126,0);
      uVar98 = uVar89 & uVar101 & uVar98;
      auVar134 = vmulps_avx512vl(auVar104,auVar132);
      auVar152._0_4_ = auVar134._0_4_ + (float)local_660._0_4_;
      auVar152._4_4_ = auVar134._4_4_ + (float)local_660._4_4_;
      auVar152._8_4_ = auVar134._8_4_ + fStack_658;
      auVar152._12_4_ = auVar134._12_4_ + fStack_654;
      auVar152._16_4_ = auVar134._16_4_ + fStack_650;
      auVar152._20_4_ = auVar134._20_4_ + fStack_64c;
      auVar152._24_4_ = auVar134._24_4_ + fStack_648;
      auVar152._28_4_ = auVar134._28_4_ + fStack_644;
      auVar134 = vmulps_avx512vl(auVar118,auVar152);
      auVar153._0_4_ = local_80._0_4_ + auVar134._0_4_;
      auVar153._4_4_ = local_80._4_4_ + auVar134._4_4_;
      auVar153._8_4_ = local_80._8_4_ + auVar134._8_4_;
      auVar153._12_4_ = local_80._12_4_ + auVar134._12_4_;
      auVar153._16_4_ = local_80._16_4_ + auVar134._16_4_;
      auVar153._20_4_ = local_80._20_4_ + auVar134._20_4_;
      auVar153._24_4_ = local_80._24_4_ + auVar134._24_4_;
      auVar153._28_4_ = local_80._28_4_ + auVar134._28_4_;
      auVar108 = vmulps_avx512vl(auVar108,auVar133);
      local_a0 = vxorps_avx512vl(auVar109,auVar157);
      auVar109 = vblendmps_avx512vl(auVar109,local_a0);
      bVar99 = (byte)uVar98;
      bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar98 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar98 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar98 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar98 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar98 >> 6) & 1);
      bVar21 = SUB81(uVar98 >> 7,0);
      auVar108 = vsubps_avx512vl(auVar153,auVar108);
      local_520._0_4_ =
           (uint)(bVar81 & 1) * auVar108._0_4_ |
           (uint)!(bool)(bVar81 & 1) *
           ((uint)(bVar99 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar99 & 1) * local_a0._0_4_);
      bVar15 = (bool)(bVar81 >> 1 & 1);
      local_520._4_4_ =
           (uint)bVar15 * auVar108._4_4_ |
           (uint)!bVar15 * ((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * local_a0._4_4_);
      bVar14 = (bool)(bVar81 >> 2 & 1);
      local_520._8_4_ =
           (uint)bVar14 * auVar108._8_4_ |
           (uint)!bVar14 * ((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * local_a0._8_4_);
      bVar14 = (bool)(bVar81 >> 3 & 1);
      local_520._12_4_ =
           (uint)bVar14 * auVar108._12_4_ |
           (uint)!bVar14 * ((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * local_a0._12_4_);
      bVar14 = (bool)(bVar81 >> 4 & 1);
      local_520._16_4_ =
           (uint)bVar14 * auVar108._16_4_ |
           (uint)!bVar14 * ((uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * local_a0._16_4_);
      bVar14 = (bool)(bVar81 >> 5 & 1);
      local_520._20_4_ =
           (uint)bVar14 * auVar108._20_4_ |
           (uint)!bVar14 * ((uint)bVar19 * auVar109._20_4_ | (uint)!bVar19 * local_a0._20_4_);
      bVar14 = (bool)(bVar81 >> 6 & 1);
      local_520._24_4_ =
           (uint)bVar14 * auVar108._24_4_ |
           (uint)!bVar14 * ((uint)bVar20 * auVar109._24_4_ | (uint)!bVar20 * local_a0._24_4_);
      local_520._28_4_ =
           (uint)(bVar81 >> 7) * auVar108._28_4_ |
           (uint)!(bool)(bVar81 >> 7) *
           ((uint)bVar21 * auVar109._28_4_ | (uint)!bVar21 * local_a0._28_4_);
      auVar165 = ZEXT3264(local_520);
      auVar108 = vmulps_avx512vl(auVar105,auVar132);
      auVar154._0_4_ = auVar108._0_4_ + (float)local_600._0_4_;
      auVar154._4_4_ = auVar108._4_4_ + (float)local_600._4_4_;
      auVar154._8_4_ = auVar108._8_4_ + fStack_5f8;
      auVar154._12_4_ = auVar108._12_4_ + fStack_5f4;
      auVar154._16_4_ = auVar108._16_4_ + fStack_5f0;
      auVar154._20_4_ = auVar108._20_4_ + fStack_5ec;
      auVar154._24_4_ = auVar108._24_4_ + fStack_5e8;
      auVar154._28_4_ = auVar108._28_4_ + local_600._28_4_;
      auVar108 = vmulps_avx512vl(auVar118,auVar154);
      auVar107 = vaddps_avx512vl(auVar107,auVar108);
      iVar137 = (uint)!(bool)(bVar99 & 1) * auVar122._0_4_;
      iVar102 = (uint)!(bool)((byte)(uVar98 >> 1) & 1) * auVar122._4_4_;
      iVar138 = (uint)!(bool)((byte)(uVar98 >> 2) & 1) * auVar122._8_4_;
      iVar139 = (uint)!(bool)((byte)(uVar98 >> 3) & 1) * auVar122._12_4_;
      iVar140 = (uint)!(bool)((byte)(uVar98 >> 4) & 1) * auVar122._16_4_;
      iVar141 = (uint)!(bool)((byte)(uVar98 >> 5) & 1) * auVar122._20_4_;
      iVar142 = (uint)!(bool)((byte)(uVar98 >> 6) & 1) * auVar122._24_4_;
      iVar143 = (uint)!SUB81(uVar98 >> 7,0) * auVar122._28_4_;
      auVar189 = ZEXT3264(CONCAT428(iVar143,CONCAT424(iVar142,CONCAT420(iVar141,CONCAT416(iVar140,
                                                  CONCAT412(iVar139,CONCAT48(iVar138,CONCAT44(
                                                  iVar102,iVar137))))))));
      auVar108 = vmulps_avx512vl(auVar133,ZEXT1632(auVar103));
      bVar14 = (bool)(bVar81 >> 1 & 1);
      bVar15 = (bool)(bVar81 >> 2 & 1);
      bVar16 = (bool)(bVar81 >> 3 & 1);
      bVar17 = (bool)(bVar81 >> 4 & 1);
      bVar18 = (bool)(bVar81 >> 5 & 1);
      bVar19 = (bool)(bVar81 >> 6 & 1);
      local_580[0] = (uint)(bVar81 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar81 & 1) * iVar137;
      local_580[1] = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * iVar102;
      local_580[2] = (uint)bVar15 * auVar108._8_4_ | (uint)!bVar15 * iVar138;
      local_580[3] = (uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * iVar139;
      uStack_570 = (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * iVar140;
      uStack_56c = (uint)bVar18 * auVar108._20_4_ | (uint)!bVar18 * iVar141;
      uStack_568 = (uint)bVar19 * auVar108._24_4_ | (uint)!bVar19 * iVar142;
      uStack_564 = (uint)(bVar81 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar81 >> 7) * iVar143;
      auVar108 = vmulps_avx512vl(auVar116,auVar133);
      local_560 = ZEXT432(0) << 0x20;
      auVar109 = vxorps_avx512vl(auVar110,auVar157);
      auVar167 = ZEXT3264(auVar109);
      local_540._0_4_ = auVar144._0_4_ + auVar132._0_4_;
      local_540._4_4_ = auVar144._4_4_ + auVar132._4_4_;
      local_540._8_4_ = auVar144._8_4_ + auVar132._8_4_;
      local_540._12_4_ = auVar144._12_4_ + auVar132._12_4_;
      local_540._16_4_ = auVar144._16_4_ + auVar132._16_4_;
      local_540._20_4_ = auVar144._20_4_ + auVar132._20_4_;
      local_540._24_4_ = auVar144._24_4_ + auVar132._24_4_;
      local_540._28_4_ = auVar132._28_4_ + 0.0;
      auVar109 = vblendmps_avx512vl(auVar110,auVar109);
      bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar98 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar98 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar98 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar98 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar98 >> 6) & 1);
      auVar107 = vsubps_avx512vl(auVar107,auVar108);
      local_500[0] = (uint)(bVar81 & 1) * auVar107._0_4_ |
                     (uint)!(bool)(bVar81 & 1) *
                     ((uint)(bVar99 & 1) * auVar109._0_4_ |
                     (uint)!(bool)(bVar99 & 1) * (int)auVar144._0_4_);
      bVar15 = (bool)(bVar81 >> 1 & 1);
      local_500[1] = (uint)bVar15 * auVar107._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * (int)auVar144._4_4_);
      bVar14 = (bool)(bVar81 >> 2 & 1);
      local_500[2] = (uint)bVar14 * auVar107._8_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * (int)auVar144._8_4_);
      bVar14 = (bool)(bVar81 >> 3 & 1);
      local_500[3] = (uint)bVar14 * auVar107._12_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * (int)auVar144._12_4_);
      bVar14 = (bool)(bVar81 >> 4 & 1);
      uStack_4f0 = (uint)bVar14 * auVar107._16_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * (int)auVar144._16_4_);
      bVar14 = (bool)(bVar81 >> 5 & 1);
      uStack_4ec = (uint)bVar14 * auVar107._20_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar19 * auVar109._20_4_ | (uint)!bVar19 * (int)auVar144._20_4_);
      bVar14 = (bool)(bVar81 >> 6 & 1);
      uStack_4e8 = (uint)bVar14 * auVar107._24_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar20 * auVar109._24_4_ | (uint)!bVar20 * (int)auVar144._24_4_);
      uStack_4e4 = (uint)(bVar81 >> 7) * auVar107._28_4_ |
                   (uint)!(bool)(bVar81 >> 7) * (uint)(byte)(uVar98 >> 7) * auVar109._28_4_;
      _local_e0 = vmulps_avx512vl(auVar111,auVar88);
      auVar107 = vmulps_avx512vl(auVar111,auVar150);
      auVar159 = ZEXT3264(auVar107);
      auVar108 = vmulps_avx512vl(auVar106,auVar132);
      auVar108 = vaddps_avx512vl(auVar112,auVar108);
      auVar108 = vmulps_avx512vl(auVar118,auVar108);
      auVar106._0_4_ = local_e0._0_4_ + auVar108._0_4_;
      auVar106._4_4_ = local_e0._4_4_ + auVar108._4_4_;
      auVar106._8_4_ = local_e0._8_4_ + auVar108._8_4_;
      auVar106._12_4_ = local_e0._12_4_ + auVar108._12_4_;
      auVar106._16_4_ = local_e0._16_4_ + auVar108._16_4_;
      auVar106._20_4_ = local_e0._20_4_ + auVar108._20_4_;
      auVar106._24_4_ = local_e0._24_4_ + auVar108._24_4_;
      auVar106._28_4_ = local_e0._28_4_ + auVar108._28_4_;
      auVar104._4_4_ = auVar107._4_4_ * auVar133._4_4_;
      auVar104._0_4_ = auVar107._0_4_ * auVar133._0_4_;
      auVar104._8_4_ = auVar107._8_4_ * auVar133._8_4_;
      auVar104._12_4_ = auVar107._12_4_ * auVar133._12_4_;
      auVar104._16_4_ = auVar107._16_4_ * auVar133._16_4_;
      auVar104._20_4_ = auVar107._20_4_ * auVar133._20_4_;
      auVar104._24_4_ = auVar107._24_4_ * auVar133._24_4_;
      auVar104._28_4_ = auVar150._28_4_;
      local_c0 = vxorps_avx512vl(auVar111,auVar157);
      auVar107 = vblendmps_avx512vl(auVar111,local_c0);
      bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar98 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar98 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar98 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar98 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar98 >> 6) & 1);
      bVar21 = SUB81(uVar98 >> 7,0);
      auVar155 = ZEXT3264(local_540);
      auVar108 = vsubps_avx512vl(auVar106,auVar104);
      local_4e0[0] = (uint)(bVar81 & 1) * auVar108._0_4_ |
                     (uint)!(bool)(bVar81 & 1) *
                     ((uint)(bVar99 & 1) * auVar107._0_4_ | !(bool)(bVar99 & 1) * local_500[0]);
      bVar15 = (bool)(bVar81 >> 1 & 1);
      local_4e0[1] = (uint)bVar15 * auVar108._4_4_ |
                     (uint)!bVar15 * ((uint)bVar14 * auVar107._4_4_ | !bVar14 * local_500[1]);
      bVar14 = (bool)(bVar81 >> 2 & 1);
      local_4e0[2] = (uint)bVar14 * auVar108._8_4_ |
                     (uint)!bVar14 * ((uint)bVar16 * auVar107._8_4_ | !bVar16 * local_500[2]);
      bVar14 = (bool)(bVar81 >> 3 & 1);
      local_4e0[3] = (uint)bVar14 * auVar108._12_4_ |
                     (uint)!bVar14 * ((uint)bVar17 * auVar107._12_4_ | !bVar17 * local_500[3]);
      bVar14 = (bool)(bVar81 >> 4 & 1);
      uStack_4d0 = (uint)bVar14 * auVar108._16_4_ |
                   (uint)!bVar14 * ((uint)bVar18 * auVar107._16_4_ | !bVar18 * uStack_4f0);
      bVar14 = (bool)(bVar81 >> 5 & 1);
      uStack_4cc = (uint)bVar14 * auVar108._20_4_ |
                   (uint)!bVar14 * ((uint)bVar19 * auVar107._20_4_ | !bVar19 * uStack_4ec);
      bVar14 = (bool)(bVar81 >> 6 & 1);
      uStack_4c8 = (uint)bVar14 * auVar108._24_4_ |
                   (uint)!bVar14 * ((uint)bVar20 * auVar107._24_4_ | !bVar20 * uStack_4e8);
      uStack_4c4 = (uint)(bVar81 >> 7) * auVar108._28_4_ |
                   (uint)!(bool)(bVar81 >> 7) *
                   ((uint)bVar21 * auVar107._28_4_ | !bVar21 * uStack_4e4);
      auVar107 = vblendmps_avx512vl(auVar119,local_540);
      auVar105._0_4_ = (uint)(bVar90 & 1) * auVar107._0_4_ | !(bool)(bVar90 & 1) * local_4e0[0];
      bVar14 = (bool)(bVar90 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar14 * auVar107._4_4_ | !bVar14 * local_4e0[1];
      bVar14 = (bool)(bVar90 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar14 * auVar107._8_4_ | !bVar14 * local_4e0[2];
      bVar14 = (bool)(bVar90 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar14 * auVar107._12_4_ | !bVar14 * local_4e0[3];
      bVar14 = (bool)(bVar90 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar14 * auVar107._16_4_ | !bVar14 * uStack_4d0;
      bVar14 = (bool)(bVar90 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar14 * auVar107._20_4_ | !bVar14 * uStack_4cc;
      bVar14 = (bool)(bVar90 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar14 * auVar107._24_4_ | !bVar14 * uStack_4c8;
      auVar105._28_4_ = (uint)(bVar90 >> 7) * auVar107._28_4_ | !(bool)(bVar90 >> 7) * uStack_4c4;
      auVar107 = vshufps_avx(auVar105,auVar105,0xb1);
      auVar107 = vminps_avx(auVar105,auVar107);
      auVar108 = vshufpd_avx(auVar107,auVar107,5);
      auVar107 = vminps_avx(auVar107,auVar108);
      auVar108 = vpermpd_avx2(auVar107,0x4e);
      auVar107 = vminps_avx(auVar107,auVar108);
      uVar77 = vcmpps_avx512vl(auVar105,auVar107,0);
      if (((byte)uVar77 & bVar90) != 0) {
        bVar90 = (byte)uVar77 & bVar90;
      }
      uVar92 = 0;
      for (uVar93 = (uint)bVar90; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
        uVar92 = uVar92 + 1;
      }
      auVar107 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar162 = ZEXT3264(auVar107);
      auVar107 = vpcmpeqd_avx2(local_540,local_540);
      auVar180 = ZEXT3264(auVar107);
      local_608 = context;
LAB_0198397f:
      bVar99 = (byte)uVar100;
      auVar107 = auVar159._0_32_;
      local_690.hit = local_4c0;
      auVar108 = auVar165._0_32_;
      auVar158 = auVar189._0_32_;
      auVar116 = auVar178._0_32_;
      auVar115 = auVar197._0_32_;
      auVar114 = auVar196._0_32_;
      auVar109 = auVar167._0_32_;
      auVar111 = auVar195._0_32_;
      auVar118 = auVar199._0_32_;
      auVar117 = auVar198._0_32_;
      auVar156 = auVar188._0_32_;
      auVar127 = auVar187._0_32_;
      auVar120 = auVar201._0_32_;
      auVar119 = auVar200._0_32_;
      auVar110 = auVar194._0_32_;
      auVar106 = auVar193._0_32_;
      auVar104 = auVar192._0_32_;
      auVar160 = auVar190._0_32_;
      auVar112 = auVar185._0_32_;
      auVar113 = auVar186._0_32_;
      auVar134 = auVar184._0_32_;
      uVar95 = uVar92 & 0xff;
      uVar93 = *(uint *)(local_100 + (ulong)uVar95 * 4);
      pGVar11 = (pSVar10->geometries).items[uVar93].ptr;
      local_690.ray = (RTCRayN *)ray;
      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
        uVar97 = (ulong)(byte)(~(byte)(1 << (uVar92 & 0x1f)) & (byte)uVar97);
        auVar145 = auVar105;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar101 = (ulong)(uVar95 << 2);
          uVar181 = *(undefined4 *)((long)local_580 + uVar101);
          uVar4 = *(undefined4 *)(local_560 + uVar101);
          auVar183 = ZEXT464(*(uint *)(local_540 + uVar101));
          *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_540 + uVar101);
          *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_520 + uVar101);
          *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_500 + uVar101);
          *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_4e0 + uVar101);
          *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar181;
          *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x220) =
               *(undefined4 *)((long)&(line->primIDs).field_0 + uVar101);
          *(uint *)(ray + k * 4 + 0x240) = uVar93;
          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01983ff1:
          uVar181 = auVar183._0_4_;
          auVar146._4_4_ = uVar181;
          auVar146._0_4_ = uVar181;
          auVar146._8_4_ = uVar181;
          auVar146._12_4_ = uVar181;
          auVar146._16_4_ = uVar181;
          auVar146._20_4_ = uVar181;
          auVar146._24_4_ = uVar181;
          auVar146._28_4_ = uVar181;
          local_540 = auVar170._0_32_;
          uVar77 = vcmpps_avx512vl(local_540,auVar146,2);
          bVar91 = bVar99 & (byte)uVar77 & bVar96 & bVar91;
          uVar101 = (ulong)bVar91;
          if (bVar91 == 0) {
            return;
          }
          uVar77 = vcmpps_avx512vl(auVar113,auVar134,0);
          uVar78 = vcmpps_avx512vl(auVar113,auVar112,0);
          bVar90 = (byte)uVar77 | (byte)uVar78;
          uVar89 = vcmpps_avx512vl(auVar113,auVar160,0);
          auVar134 = vmulps_avx512vl(auVar104,auVar113);
          auVar112 = vmulps_avx512vl(auVar106,auVar113);
          auVar113 = vmulps_avx512vl(auVar110,auVar113);
          auVar147._0_4_ = auVar134._0_4_ + (float)local_660._0_4_;
          auVar147._4_4_ = auVar134._4_4_ + (float)local_660._4_4_;
          auVar147._8_4_ = auVar134._8_4_ + fStack_658;
          auVar147._12_4_ = auVar134._12_4_ + fStack_654;
          auVar147._16_4_ = auVar134._16_4_ + fStack_650;
          auVar147._20_4_ = auVar134._20_4_ + fStack_64c;
          auVar147._24_4_ = auVar134._24_4_ + fStack_648;
          auVar147._28_4_ = auVar134._28_4_ + fStack_644;
          auVar149._0_4_ = auVar112._0_4_ + (float)local_600._0_4_;
          auVar149._4_4_ = auVar112._4_4_ + (float)local_600._4_4_;
          auVar149._8_4_ = auVar112._8_4_ + fStack_5f8;
          auVar149._12_4_ = auVar112._12_4_ + fStack_5f4;
          auVar149._16_4_ = auVar112._16_4_ + fStack_5f0;
          auVar149._20_4_ = auVar112._20_4_ + fStack_5ec;
          auVar149._24_4_ = auVar112._24_4_ + fStack_5e8;
          auVar149._28_4_ = auVar112._28_4_ + fStack_5e4;
          auVar134 = vaddps_avx512vl(auVar119,auVar113);
          auVar112 = vmulps_avx512vl(auVar120,auVar147);
          auVar113 = vmulps_avx512vl(auVar120,auVar149);
          auVar134 = vmulps_avx512vl(auVar120,auVar134);
          auVar148._0_4_ = auVar112._0_4_ + (float)local_80._0_4_;
          auVar148._4_4_ = auVar112._4_4_ + (float)local_80._4_4_;
          auVar148._8_4_ = auVar112._8_4_ + fStack_78;
          auVar148._12_4_ = auVar112._12_4_ + fStack_74;
          auVar148._16_4_ = auVar112._16_4_ + fStack_70;
          auVar148._20_4_ = auVar112._20_4_ + fStack_6c;
          auVar148._24_4_ = auVar112._24_4_ + fStack_68;
          auVar148._28_4_ = auVar112._28_4_ + fStack_64;
          auVar112 = vaddps_avx512vl(auVar127,auVar113);
          auVar151._0_4_ = auVar134._0_4_ + (float)local_e0._0_4_;
          auVar151._4_4_ = auVar134._4_4_ + (float)local_e0._4_4_;
          auVar151._8_4_ = auVar134._8_4_ + fStack_d8;
          auVar151._12_4_ = auVar134._12_4_ + fStack_d4;
          auVar151._16_4_ = auVar134._16_4_ + fStack_d0;
          auVar151._20_4_ = auVar134._20_4_ + fStack_cc;
          auVar151._24_4_ = auVar134._24_4_ + fStack_c8;
          auVar151._28_4_ = auVar134._28_4_ + fStack_c4;
          auVar134 = vmulps_avx512vl(auVar156,auVar117);
          auVar113 = vmulps_avx512vl(auVar118,auVar117);
          auVar107 = vmulps_avx512vl(auVar107,auVar117);
          bVar99 = (byte)uVar89;
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar46 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar29 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar38 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar47 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar56 = SUB81(uVar89 >> 7,0);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar54 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar30 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar39 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar48 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar57 = SUB81(uVar89 >> 7,0);
          bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar27 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar55 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar31 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar40 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar49 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar58 = SUB81(uVar89 >> 7,0);
          auVar134 = vsubps_avx512vl(auVar148,auVar134);
          bVar17 = (bool)(bVar90 >> 1 & 1);
          bVar28 = (bool)(bVar90 >> 2 & 1);
          bVar23 = (bool)(bVar90 >> 3 & 1);
          bVar32 = (bool)(bVar90 >> 4 & 1);
          bVar41 = (bool)(bVar90 >> 5 & 1);
          bVar50 = (bool)(bVar90 >> 6 & 1);
          auVar112 = vsubps_avx512vl(auVar112,auVar113);
          bVar18 = (bool)(bVar90 >> 1 & 1);
          bVar36 = (bool)(bVar90 >> 2 & 1);
          bVar24 = (bool)(bVar90 >> 3 & 1);
          bVar33 = (bool)(bVar90 >> 4 & 1);
          bVar42 = (bool)(bVar90 >> 5 & 1);
          bVar51 = (bool)(bVar90 >> 6 & 1);
          auVar107 = vsubps_avx512vl(auVar151,auVar107);
          bVar19 = (bool)(bVar90 >> 1 & 1);
          bVar37 = (bool)(bVar90 >> 2 & 1);
          bVar25 = (bool)(bVar90 >> 3 & 1);
          bVar34 = (bool)(bVar90 >> 4 & 1);
          bVar43 = (bool)(bVar90 >> 5 & 1);
          bVar52 = (bool)(bVar90 >> 6 & 1);
          auVar116 = vmulps_avx512vl(auVar117,auVar116);
          bVar20 = (bool)(bVar90 >> 1 & 1);
          bVar45 = (bool)(bVar90 >> 2 & 1);
          bVar26 = (bool)(bVar90 >> 3 & 1);
          bVar35 = (bool)(bVar90 >> 4 & 1);
          bVar44 = (bool)(bVar90 >> 5 & 1);
          bVar53 = (bool)(bVar90 >> 6 & 1);
          local_580[0] = (uint)(bVar90 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * auVar158._0_4_;
          local_580[1] = (uint)bVar20 * auVar116._4_4_ | (uint)!bVar20 * auVar158._4_4_;
          local_580[2] = (uint)bVar45 * auVar116._8_4_ | (uint)!bVar45 * auVar158._8_4_;
          local_580[3] = (uint)bVar26 * auVar116._12_4_ | (uint)!bVar26 * auVar158._12_4_;
          uStack_570 = (uint)bVar35 * auVar116._16_4_ | (uint)!bVar35 * auVar158._16_4_;
          uStack_56c = (uint)bVar44 * auVar116._20_4_ | (uint)!bVar44 * auVar158._20_4_;
          uStack_568 = (uint)bVar53 * auVar116._24_4_ | (uint)!bVar53 * auVar158._24_4_;
          uStack_564 = (uint)(bVar90 >> 7) * auVar116._28_4_ |
                       (uint)!(bool)(bVar90 >> 7) * auVar158._28_4_;
          local_560 = ZEXT432(0) << 0x20;
          local_520._4_4_ =
               (uint)bVar17 * auVar134._4_4_ |
               (uint)!bVar17 * ((uint)bVar14 * local_a0._4_4_ | (uint)!bVar14 * auVar111._4_4_);
          local_520._0_4_ =
               (uint)(bVar90 & 1) * auVar134._0_4_ |
               (uint)!(bool)(bVar90 & 1) *
               ((uint)(bVar99 & 1) * local_a0._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar111._0_4_);
          local_520._8_4_ =
               (uint)bVar28 * auVar134._8_4_ |
               (uint)!bVar28 * ((uint)bVar21 * local_a0._8_4_ | (uint)!bVar21 * auVar111._8_4_);
          local_520._12_4_ =
               (uint)bVar23 * auVar134._12_4_ |
               (uint)!bVar23 * ((uint)bVar46 * local_a0._12_4_ | (uint)!bVar46 * auVar111._12_4_);
          local_520._16_4_ =
               (uint)bVar32 * auVar134._16_4_ |
               (uint)!bVar32 * ((uint)bVar29 * local_a0._16_4_ | (uint)!bVar29 * auVar111._16_4_);
          local_520._20_4_ =
               (uint)bVar41 * auVar134._20_4_ |
               (uint)!bVar41 * ((uint)bVar38 * local_a0._20_4_ | (uint)!bVar38 * auVar111._20_4_);
          local_520._24_4_ =
               (uint)bVar50 * auVar134._24_4_ |
               (uint)!bVar50 * ((uint)bVar47 * local_a0._24_4_ | (uint)!bVar47 * auVar111._24_4_);
          local_520._28_4_ =
               (uint)(bVar90 >> 7) * auVar134._28_4_ |
               (uint)!(bool)(bVar90 >> 7) *
               ((uint)bVar56 * local_a0._28_4_ | (uint)!bVar56 * auVar111._28_4_);
          local_500[0] = (uint)(bVar90 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar90 & 1) *
                         ((uint)(bVar99 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar114._0_4_);
          local_500[1] = (uint)bVar18 * auVar112._4_4_ |
                         (uint)!bVar18 *
                         ((uint)bVar15 * auVar109._4_4_ | (uint)!bVar15 * auVar114._4_4_);
          local_500[2] = (uint)bVar36 * auVar112._8_4_ |
                         (uint)!bVar36 *
                         ((uint)bVar22 * auVar109._8_4_ | (uint)!bVar22 * auVar114._8_4_);
          local_500[3] = (uint)bVar24 * auVar112._12_4_ |
                         (uint)!bVar24 *
                         ((uint)bVar54 * auVar109._12_4_ | (uint)!bVar54 * auVar114._12_4_);
          uStack_4f0 = (uint)bVar33 * auVar112._16_4_ |
                       (uint)!bVar33 *
                       ((uint)bVar30 * auVar109._16_4_ | (uint)!bVar30 * auVar114._16_4_);
          uStack_4ec = (uint)bVar42 * auVar112._20_4_ |
                       (uint)!bVar42 *
                       ((uint)bVar39 * auVar109._20_4_ | (uint)!bVar39 * auVar114._20_4_);
          uStack_4e8 = (uint)bVar51 * auVar112._24_4_ |
                       (uint)!bVar51 *
                       ((uint)bVar48 * auVar109._24_4_ | (uint)!bVar48 * auVar114._24_4_);
          uStack_4e4 = (uint)(bVar90 >> 7) * auVar112._28_4_ |
                       (uint)!(bool)(bVar90 >> 7) *
                       ((uint)bVar57 * auVar109._28_4_ | (uint)!bVar57 * auVar114._28_4_);
          local_4e0[0] = (uint)(bVar90 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar90 & 1) *
                         ((uint)(bVar99 & 1) * local_c0._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar115._0_4_);
          local_4e0[1] = (uint)bVar19 * auVar107._4_4_ |
                         (uint)!bVar19 *
                         ((uint)bVar16 * local_c0._4_4_ | (uint)!bVar16 * auVar115._4_4_);
          local_4e0[2] = (uint)bVar37 * auVar107._8_4_ |
                         (uint)!bVar37 *
                         ((uint)bVar27 * local_c0._8_4_ | (uint)!bVar27 * auVar115._8_4_);
          local_4e0[3] = (uint)bVar25 * auVar107._12_4_ |
                         (uint)!bVar25 *
                         ((uint)bVar55 * local_c0._12_4_ | (uint)!bVar55 * auVar115._12_4_);
          uStack_4d0 = (uint)bVar34 * auVar107._16_4_ |
                       (uint)!bVar34 *
                       ((uint)bVar31 * local_c0._16_4_ | (uint)!bVar31 * auVar115._16_4_);
          uStack_4cc = (uint)bVar43 * auVar107._20_4_ |
                       (uint)!bVar43 *
                       ((uint)bVar40 * local_c0._20_4_ | (uint)!bVar40 * auVar115._20_4_);
          uStack_4c8 = (uint)bVar52 * auVar107._24_4_ |
                       (uint)!bVar52 *
                       ((uint)bVar49 * local_c0._24_4_ | (uint)!bVar49 * auVar115._24_4_);
          uStack_4c4 = (uint)(bVar90 >> 7) * auVar107._28_4_ |
                       (uint)!(bool)(bVar90 >> 7) *
                       ((uint)bVar58 * local_c0._28_4_ | (uint)!bVar58 * auVar115._28_4_);
          auVar94 = (undefined1  [8])context->scene;
          auVar107 = vblendmps_avx512vl(auVar191._0_32_,local_540);
          auVar135._4_4_ = (uint)(bVar91 >> 1 & 1) * auVar107._4_4_;
          auVar135._0_4_ = (uint)(bVar91 & 1) * auVar107._0_4_;
          auVar135._8_4_ = (uint)(bVar91 >> 2 & 1) * auVar107._8_4_;
          auVar135._12_4_ = (uint)(bVar91 >> 3 & 1) * auVar107._12_4_;
          auVar135._16_4_ = (uint)(bVar91 >> 4 & 1) * auVar107._16_4_;
          auVar135._20_4_ = (uint)(bVar91 >> 5 & 1) * auVar107._20_4_;
          auVar135._24_4_ = (uint)(bVar91 >> 6 & 1) * auVar107._24_4_;
          auVar135._28_4_ = (uint)(bVar91 >> 7) * auVar107._28_4_;
          auVar107 = vshufps_avx(auVar135,auVar135,0xb1);
          auVar107 = vminps_avx(auVar135,auVar107);
          auVar109 = vshufpd_avx(auVar107,auVar107,5);
          auVar107 = vminps_avx(auVar107,auVar109);
          auVar109 = vpermpd_avx2(auVar107,0x4e);
          auVar107 = vminps_avx(auVar107,auVar109);
          uVar77 = vcmpps_avx512vl(auVar135,auVar107,0);
          if (((byte)uVar77 & bVar91) != 0) {
            bVar91 = (byte)uVar77 & bVar91;
          }
          uVar92 = 0;
          for (uVar93 = (uint)bVar91; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
            uVar92 = uVar92 + 1;
          }
          auVar107 = vpcmpeqd_avx2(auVar108,auVar108);
          auVar192 = ZEXT3264(auVar107);
          do {
            local_690.hit = local_4c0;
            uVar95 = uVar92 & 0xff;
            uVar93 = *(uint *)(local_100 + (ulong)uVar95 * 4);
            pGVar11 = (((Scene *)auVar94)->geometries).items[uVar93].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar101 = (ulong)(byte)(~(byte)(1 << (uVar92 & 0x1f)) & (byte)uVar101);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar101 = (ulong)(uVar95 << 2);
                uVar181 = *(undefined4 *)((long)local_580 + uVar101);
                uVar4 = *(undefined4 *)(local_560 + uVar101);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_540 + uVar101);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_520 + uVar101);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_500 + uVar101);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_4e0 + uVar101);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar181;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&(line->primIDs).field_0 + uVar101);
                *(uint *)(ray + k * 4 + 0x240) = uVar93;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                return;
              }
              uVar89 = (ulong)(uVar95 * 4);
              local_460 = *(undefined4 *)((long)local_580 + uVar89);
              local_440 = *(undefined4 *)(local_560 + uVar89);
              local_400 = vpbroadcastd_avx512vl();
              uVar181 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar89);
              local_420._4_4_ = uVar181;
              local_420._0_4_ = uVar181;
              local_420._8_4_ = uVar181;
              local_420._12_4_ = uVar181;
              local_420._16_4_ = uVar181;
              local_420._20_4_ = uVar181;
              local_420._24_4_ = uVar181;
              local_420._28_4_ = uVar181;
              uVar181 = *(undefined4 *)(local_520 + uVar89);
              uVar4 = *(undefined4 *)((long)local_500 + uVar89);
              local_4a0._4_4_ = uVar4;
              local_4a0._0_4_ = uVar4;
              local_4a0._8_4_ = uVar4;
              local_4a0._12_4_ = uVar4;
              local_4a0._16_4_ = uVar4;
              local_4a0._20_4_ = uVar4;
              local_4a0._24_4_ = uVar4;
              local_4a0._28_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)local_4e0 + uVar89);
              local_480._4_4_ = uVar4;
              local_480._0_4_ = uVar4;
              local_480._8_4_ = uVar4;
              local_480._12_4_ = uVar4;
              local_480._16_4_ = uVar4;
              local_480._20_4_ = uVar4;
              local_480._24_4_ = uVar4;
              local_480._28_4_ = uVar4;
              local_4c0[0] = (RTCHitN)(char)uVar181;
              local_4c0[1] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[2] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[3] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[4] = (RTCHitN)(char)uVar181;
              local_4c0[5] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[6] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[7] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[8] = (RTCHitN)(char)uVar181;
              local_4c0[9] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[10] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[0xb] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[0xc] = (RTCHitN)(char)uVar181;
              local_4c0[0xd] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[0xe] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[0xf] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[0x10] = (RTCHitN)(char)uVar181;
              local_4c0[0x11] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[0x12] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[0x13] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[0x14] = (RTCHitN)(char)uVar181;
              local_4c0[0x15] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[0x16] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[0x17] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[0x18] = (RTCHitN)(char)uVar181;
              local_4c0[0x19] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[0x1a] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[0x1b] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              local_4c0[0x1c] = (RTCHitN)(char)uVar181;
              local_4c0[0x1d] = (RTCHitN)(char)((uint)uVar181 >> 8);
              local_4c0[0x1e] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
              local_4c0[0x1f] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
              uStack_45c = local_460;
              uStack_458 = local_460;
              uStack_454 = local_460;
              uStack_450 = local_460;
              uStack_44c = local_460;
              uStack_448 = local_460;
              uStack_444 = local_460;
              uStack_43c = local_440;
              uStack_438 = local_440;
              uStack_434 = local_440;
              uStack_430 = local_440;
              uStack_42c = local_440;
              uStack_428 = local_440;
              uStack_424 = local_440;
              uStack_3dc = context->user->instID[0];
              local_3e0 = uStack_3dc;
              uStack_3d8 = uStack_3dc;
              uStack_3d4 = uStack_3dc;
              uStack_3d0 = uStack_3dc;
              uStack_3cc = uStack_3dc;
              uStack_3c8 = uStack_3dc;
              uStack_3c4 = uStack_3dc;
              uStack_3bc = context->user->instPrimID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = uStack_3bc;
              uStack_3ac = uStack_3bc;
              uStack_3a8 = uStack_3bc;
              uStack_3a4 = uStack_3bc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_540 + uVar89);
              local_640 = auVar162._0_32_;
              local_690.valid = (int *)local_640;
              local_690.geometryUserPtr = pGVar11->userPtr;
              local_690.context = context->user;
              local_690.N = 8;
              local_5a0 = auVar170._0_32_;
              local_5c0 = auVar183._0_32_;
              local_660 = auVar94;
              local_600._0_4_ = (int)uVar101;
              local_690.ray = (RTCRayN *)ray;
              local_5e0 = local_640;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar107 = ZEXT1632(auVar192._0_16_);
                (*pGVar11->intersectionFilterN)(&local_690);
                auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
                auVar192 = ZEXT3264(auVar107);
                auVar162 = ZEXT3264(local_5e0);
                uVar101 = (ulong)(uint)local_600._0_4_;
                auVar183 = ZEXT3264(local_5c0);
                auVar170 = ZEXT3264(local_5a0);
                auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar191 = ZEXT3264(auVar107);
                auVar94 = local_660;
              }
              bVar91 = (byte)uVar101;
              if (local_640 == (undefined1  [32])0x0) {
LAB_019844a6:
                *(int *)(ray + k * 4 + 0x100) = auVar183._0_4_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar107 = ZEXT1632(auVar192._0_16_);
                  (*p_Var13)(&local_690);
                  auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
                  auVar192 = ZEXT3264(auVar107);
                  auVar162 = ZEXT3264(local_5e0);
                  bVar91 = local_600[0];
                  auVar183 = ZEXT3264(local_5c0);
                  auVar170 = ZEXT3264(local_5a0);
                  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar191 = ZEXT3264(auVar107);
                  auVar94 = local_660;
                }
                if (local_640 == (undefined1  [32])0x0) goto LAB_019844a6;
                uVar101 = vptestmd_avx512vl(local_640,local_640);
                iVar102 = *(int *)(local_690.hit + 4);
                iVar137 = *(int *)(local_690.hit + 8);
                iVar138 = *(int *)(local_690.hit + 0xc);
                iVar139 = *(int *)(local_690.hit + 0x10);
                iVar140 = *(int *)(local_690.hit + 0x14);
                iVar141 = *(int *)(local_690.hit + 0x18);
                iVar142 = *(int *)(local_690.hit + 0x1c);
                bVar99 = (byte)uVar101;
                bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar101 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar101 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar101 >> 6) & 1);
                bVar20 = SUB81(uVar101 >> 7,0);
                *(uint *)(local_690.ray + 0x180) =
                     (uint)(bVar99 & 1) * *(int *)local_690.hit |
                     (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x180);
                *(uint *)(local_690.ray + 0x184) =
                     (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x184);
                *(uint *)(local_690.ray + 0x188) =
                     (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x188);
                *(uint *)(local_690.ray + 0x18c) =
                     (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x18c);
                *(uint *)(local_690.ray + 400) =
                     (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 400);
                *(uint *)(local_690.ray + 0x194) =
                     (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x194);
                *(uint *)(local_690.ray + 0x198) =
                     (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x198);
                *(uint *)(local_690.ray + 0x19c) =
                     (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x19c);
                iVar102 = *(int *)(local_690.hit + 0x24);
                iVar137 = *(int *)(local_690.hit + 0x28);
                iVar138 = *(int *)(local_690.hit + 0x2c);
                iVar139 = *(int *)(local_690.hit + 0x30);
                iVar140 = *(int *)(local_690.hit + 0x34);
                iVar141 = *(int *)(local_690.hit + 0x38);
                iVar142 = *(int *)(local_690.hit + 0x3c);
                bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar101 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar101 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar101 >> 6) & 1);
                bVar20 = SUB81(uVar101 >> 7,0);
                *(uint *)(local_690.ray + 0x1a0) =
                     (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x20) |
                     (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x1a0);
                *(uint *)(local_690.ray + 0x1a4) =
                     (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x1a4);
                *(uint *)(local_690.ray + 0x1a8) =
                     (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x1a8);
                *(uint *)(local_690.ray + 0x1ac) =
                     (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x1ac);
                *(uint *)(local_690.ray + 0x1b0) =
                     (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x1b0);
                *(uint *)(local_690.ray + 0x1b4) =
                     (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x1b4);
                *(uint *)(local_690.ray + 0x1b8) =
                     (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x1b8);
                *(uint *)(local_690.ray + 0x1bc) =
                     (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x1bc);
                iVar102 = *(int *)(local_690.hit + 0x44);
                iVar137 = *(int *)(local_690.hit + 0x48);
                iVar138 = *(int *)(local_690.hit + 0x4c);
                iVar139 = *(int *)(local_690.hit + 0x50);
                iVar140 = *(int *)(local_690.hit + 0x54);
                iVar141 = *(int *)(local_690.hit + 0x58);
                iVar142 = *(int *)(local_690.hit + 0x5c);
                bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar101 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar101 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar101 >> 6) & 1);
                bVar20 = SUB81(uVar101 >> 7,0);
                *(uint *)(local_690.ray + 0x1c0) =
                     (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x40) |
                     (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x1c0);
                *(uint *)(local_690.ray + 0x1c4) =
                     (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x1c4);
                *(uint *)(local_690.ray + 0x1c8) =
                     (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x1c8);
                *(uint *)(local_690.ray + 0x1cc) =
                     (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x1cc);
                *(uint *)(local_690.ray + 0x1d0) =
                     (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x1d0);
                *(uint *)(local_690.ray + 0x1d4) =
                     (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x1d4);
                *(uint *)(local_690.ray + 0x1d8) =
                     (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x1d8);
                *(uint *)(local_690.ray + 0x1dc) =
                     (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x1dc);
                iVar102 = *(int *)(local_690.hit + 100);
                iVar137 = *(int *)(local_690.hit + 0x68);
                iVar138 = *(int *)(local_690.hit + 0x6c);
                iVar139 = *(int *)(local_690.hit + 0x70);
                iVar140 = *(int *)(local_690.hit + 0x74);
                iVar141 = *(int *)(local_690.hit + 0x78);
                iVar142 = *(int *)(local_690.hit + 0x7c);
                bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar101 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar101 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar101 >> 6) & 1);
                bVar20 = SUB81(uVar101 >> 7,0);
                *(uint *)(local_690.ray + 0x1e0) =
                     (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x60) |
                     (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x1e0);
                *(uint *)(local_690.ray + 0x1e4) =
                     (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x1e4);
                *(uint *)(local_690.ray + 0x1e8) =
                     (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x1e8);
                *(uint *)(local_690.ray + 0x1ec) =
                     (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x1ec);
                *(uint *)(local_690.ray + 0x1f0) =
                     (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x1f0);
                *(uint *)(local_690.ray + 500) =
                     (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 500);
                *(uint *)(local_690.ray + 0x1f8) =
                     (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x1f8);
                *(uint *)(local_690.ray + 0x1fc) =
                     (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x1fc);
                iVar102 = *(int *)(local_690.hit + 0x84);
                iVar137 = *(int *)(local_690.hit + 0x88);
                iVar138 = *(int *)(local_690.hit + 0x8c);
                iVar139 = *(int *)(local_690.hit + 0x90);
                iVar140 = *(int *)(local_690.hit + 0x94);
                iVar141 = *(int *)(local_690.hit + 0x98);
                iVar142 = *(int *)(local_690.hit + 0x9c);
                bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar101 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar101 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar101 >> 6) & 1);
                bVar20 = SUB81(uVar101 >> 7,0);
                *(uint *)(local_690.ray + 0x200) =
                     (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x80) |
                     (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x200);
                *(uint *)(local_690.ray + 0x204) =
                     (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x204);
                *(uint *)(local_690.ray + 0x208) =
                     (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x208);
                *(uint *)(local_690.ray + 0x20c) =
                     (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x20c);
                *(uint *)(local_690.ray + 0x210) =
                     (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x210);
                *(uint *)(local_690.ray + 0x214) =
                     (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x214);
                *(uint *)(local_690.ray + 0x218) =
                     (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x218);
                *(uint *)(local_690.ray + 0x21c) =
                     (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x21c);
                auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0xa0));
                *(undefined1 (*) [32])(local_690.ray + 0x220) = auVar107;
                auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0xc0));
                *(undefined1 (*) [32])(local_690.ray + 0x240) = auVar107;
                auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0xe0));
                *(undefined1 (*) [32])(local_690.ray + 0x260) = auVar107;
                auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0x100));
                *(undefined1 (*) [32])(local_690.ray + 0x280) = auVar107;
                auVar183 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              uVar181 = auVar183._0_4_;
              auVar135._4_4_ = uVar181;
              auVar135._0_4_ = uVar181;
              auVar135._8_4_ = uVar181;
              auVar135._12_4_ = uVar181;
              auVar135._16_4_ = uVar181;
              auVar135._20_4_ = uVar181;
              auVar135._24_4_ = uVar181;
              auVar135._28_4_ = uVar181;
              uVar101 = vcmpps_avx512vl(auVar170._0_32_,auVar135,2);
              uVar101 = (~(byte)(1 << (uVar92 & 0x1f)) & bVar91) & uVar101;
            }
            bVar91 = (byte)uVar101;
            if (bVar91 == 0) {
              return;
            }
            auVar107 = vblendmps_avx512vl(auVar191._0_32_,auVar170._0_32_);
            auVar136._0_4_ =
                 (uint)(bVar91 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar135._0_4_;
            bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar135._4_4_;
            bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar135._8_4_;
            bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar135._12_4_;
            bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar136._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar135._16_4_;
            bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar136._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar135._20_4_;
            bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar136._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar135._24_4_;
            bVar14 = SUB81(uVar101 >> 7,0);
            auVar136._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * auVar135._28_4_;
            auVar107 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar107 = vminps_avx(auVar136,auVar107);
            auVar108 = vshufpd_avx(auVar107,auVar107,5);
            auVar107 = vminps_avx(auVar107,auVar108);
            auVar108 = vpermpd_avx2(auVar107,0x4e);
            auVar107 = vminps_avx(auVar107,auVar108);
            uVar77 = vcmpps_avx512vl(auVar136,auVar107,0);
            bVar91 = (byte)uVar77 & bVar91;
            uVar93 = (uint)uVar101;
            if (bVar91 != 0) {
              uVar93 = (uint)bVar91;
            }
            uVar92 = 0;
            for (; auVar135 = auVar136, (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
              uVar92 = uVar92 + 1;
            }
          } while( true );
        }
        local_140 = auVar155._0_32_;
        local_120 = auVar107;
        uVar101 = (ulong)(uVar95 * 4);
        local_460 = *(undefined4 *)((long)local_580 + uVar101);
        local_440 = *(undefined4 *)(local_560 + uVar101);
        local_400 = vpbroadcastd_avx512vl();
        local_420._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar101);
        uVar181 = *(undefined4 *)(local_520 + uVar101);
        uVar4 = *(undefined4 *)((long)local_500 + uVar101);
        local_4a0._4_4_ = uVar4;
        local_4a0._0_4_ = uVar4;
        local_4a0._8_4_ = uVar4;
        local_4a0._12_4_ = uVar4;
        local_4a0._16_4_ = uVar4;
        local_4a0._20_4_ = uVar4;
        local_4a0._24_4_ = uVar4;
        local_4a0._28_4_ = uVar4;
        local_480._4_4_ = *(undefined4 *)((long)local_4e0 + uVar101);
        local_4c0[0] = (RTCHitN)(char)uVar181;
        local_4c0[1] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[2] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[3] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[4] = (RTCHitN)(char)uVar181;
        local_4c0[5] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[6] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[7] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[8] = (RTCHitN)(char)uVar181;
        local_4c0[9] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[10] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[0xb] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[0xc] = (RTCHitN)(char)uVar181;
        local_4c0[0xd] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[0xe] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[0xf] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[0x10] = (RTCHitN)(char)uVar181;
        local_4c0[0x11] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[0x12] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[0x13] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[0x14] = (RTCHitN)(char)uVar181;
        local_4c0[0x15] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[0x16] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[0x17] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[0x18] = (RTCHitN)(char)uVar181;
        local_4c0[0x19] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[0x1a] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[0x1b] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_4c0[0x1c] = (RTCHitN)(char)uVar181;
        local_4c0[0x1d] = (RTCHitN)(char)((uint)uVar181 >> 8);
        local_4c0[0x1e] = (RTCHitN)(char)((uint)uVar181 >> 0x10);
        local_4c0[0x1f] = (RTCHitN)(char)((uint)uVar181 >> 0x18);
        local_480._0_4_ = local_480._4_4_;
        local_480._8_4_ = local_480._4_4_;
        local_480._12_4_ = local_480._4_4_;
        local_480._16_4_ = local_480._4_4_;
        local_480._20_4_ = local_480._4_4_;
        local_480._24_4_ = local_480._4_4_;
        local_480._28_4_ = local_480._4_4_;
        uStack_45c = local_460;
        uStack_458 = local_460;
        uStack_454 = local_460;
        uStack_450 = local_460;
        uStack_44c = local_460;
        uStack_448 = local_460;
        uStack_444 = local_460;
        uStack_43c = local_440;
        uStack_438 = local_440;
        uStack_434 = local_440;
        uStack_430 = local_440;
        uStack_42c = local_440;
        uStack_428 = local_440;
        uStack_424 = local_440;
        local_420._0_4_ = local_420._4_4_;
        local_420._8_4_ = local_420._4_4_;
        local_420._12_4_ = local_420._4_4_;
        local_420._16_4_ = local_420._4_4_;
        local_420._20_4_ = local_420._4_4_;
        local_420._24_4_ = local_420._4_4_;
        local_420._28_4_ = local_420._4_4_;
        uStack_3dc = context->user->instID[0];
        local_3e0 = uStack_3dc;
        uStack_3d8 = uStack_3dc;
        uStack_3d4 = uStack_3dc;
        uStack_3d0 = uStack_3dc;
        uStack_3cc = uStack_3dc;
        uStack_3c8 = uStack_3dc;
        uStack_3c4 = uStack_3dc;
        uStack_3bc = context->user->instPrimID[0];
        local_3c0 = uStack_3bc;
        uStack_3b8 = uStack_3bc;
        uStack_3b4 = uStack_3bc;
        uStack_3b0 = uStack_3bc;
        uStack_3ac = uStack_3bc;
        uStack_3a8 = uStack_3bc;
        uStack_3a4 = uStack_3bc;
        *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_540 + uVar101);
        local_640 = auVar162._0_32_;
        local_690.valid = (int *)local_640;
        local_690.geometryUserPtr = pGVar11->userPtr;
        local_690.context = context->user;
        local_690.N = 8;
        local_5a0 = auVar170._0_32_;
        local_160 = auVar104;
        local_180 = auVar106;
        local_1a0 = auVar110;
        local_1c0 = auVar111;
        local_1e0 = auVar114;
        local_200 = auVar115;
        local_5c0 = auVar183._0_32_;
        local_220 = auVar119;
        local_240 = auVar120;
        local_260 = auVar158;
        local_280 = auVar117;
        local_2a0 = auVar160;
        local_2c0 = auVar134;
        local_2e0 = auVar112;
        local_300 = auVar113;
        local_320 = auVar116;
        local_340 = auVar127;
        local_360 = auVar156;
        local_380 = auVar118;
        local_3a0 = auVar109;
        uVar101 = uVar100;
        local_5e0 = local_640;
        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
          auVar165 = ZEXT1664(auVar165._0_16_);
          auVar107 = ZEXT1632(auVar180._0_16_);
          (*pGVar11->intersectionFilterN)(&local_690);
          auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
          auVar180 = ZEXT3264(auVar107);
          auVar167 = ZEXT3264(local_3a0);
          auVar199 = ZEXT3264(local_380);
          auVar188 = ZEXT3264(local_360);
          auVar187 = ZEXT3264(local_340);
          uVar101 = uVar100 & 0xffff;
          auVar178 = ZEXT3264(local_320);
          auVar186 = ZEXT3264(local_300);
          auVar185 = ZEXT3264(local_2e0);
          auVar184 = ZEXT3264(local_2c0);
          auVar190 = ZEXT3264(local_2a0);
          auVar198 = ZEXT3264(local_280);
          auVar162 = ZEXT3264(local_5e0);
          auVar189 = ZEXT3264(local_260);
          auVar201 = ZEXT3264(local_240);
          auVar200 = ZEXT3264(local_220);
          auVar183 = ZEXT3264(local_5c0);
          auVar197 = ZEXT3264(local_200);
          auVar196 = ZEXT3264(local_1e0);
          auVar195 = ZEXT3264(local_1c0);
          auVar194 = ZEXT3264(local_1a0);
          auVar193 = ZEXT3264(local_180);
          auVar192 = ZEXT3264(local_160);
          auVar170 = ZEXT3264(local_5a0);
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar191 = ZEXT3264(auVar107);
        }
        auVar159 = ZEXT3264(local_120);
        auVar155 = ZEXT3264(local_140);
        if (local_640 == (undefined1  [32])0x0) {
LAB_01983f18:
          *(int *)(ray + k * 4 + 0x100) = auVar183._0_4_;
        }
        else {
          p_Var13 = context->args->filter;
          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
            auVar165 = ZEXT1664(auVar165._0_16_);
            auVar107 = ZEXT1632(auVar180._0_16_);
            (*p_Var13)(&local_690);
            auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
            auVar180 = ZEXT3264(auVar107);
            auVar155 = ZEXT3264(local_140);
            auVar159 = ZEXT3264(local_120);
            auVar167 = ZEXT3264(local_3a0);
            auVar199 = ZEXT3264(local_380);
            auVar188 = ZEXT3264(local_360);
            auVar187 = ZEXT3264(local_340);
            uVar101 = uVar100 & 0xffff;
            auVar178 = ZEXT3264(local_320);
            auVar186 = ZEXT3264(local_300);
            auVar185 = ZEXT3264(local_2e0);
            auVar184 = ZEXT3264(local_2c0);
            auVar190 = ZEXT3264(local_2a0);
            auVar198 = ZEXT3264(local_280);
            auVar162 = ZEXT3264(local_5e0);
            auVar189 = ZEXT3264(local_260);
            auVar201 = ZEXT3264(local_240);
            auVar200 = ZEXT3264(local_220);
            auVar183 = ZEXT3264(local_5c0);
            auVar197 = ZEXT3264(local_200);
            auVar196 = ZEXT3264(local_1e0);
            auVar195 = ZEXT3264(local_1c0);
            auVar194 = ZEXT3264(local_1a0);
            auVar193 = ZEXT3264(local_180);
            auVar192 = ZEXT3264(local_160);
            auVar170 = ZEXT3264(local_5a0);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar191 = ZEXT3264(auVar107);
          }
          if (local_640 == (undefined1  [32])0x0) goto LAB_01983f18;
          uVar89 = vptestmd_avx512vl(local_640,local_640);
          iVar102 = *(int *)(local_690.hit + 4);
          iVar137 = *(int *)(local_690.hit + 8);
          iVar138 = *(int *)(local_690.hit + 0xc);
          iVar139 = *(int *)(local_690.hit + 0x10);
          iVar140 = *(int *)(local_690.hit + 0x14);
          iVar141 = *(int *)(local_690.hit + 0x18);
          iVar142 = *(int *)(local_690.hit + 0x1c);
          bVar99 = (byte)uVar89;
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar20 = SUB81(uVar89 >> 7,0);
          *(uint *)(local_690.ray + 0x180) =
               (uint)(bVar99 & 1) * *(int *)local_690.hit |
               (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x180);
          *(uint *)(local_690.ray + 0x184) =
               (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x184);
          *(uint *)(local_690.ray + 0x188) =
               (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x188);
          *(uint *)(local_690.ray + 0x18c) =
               (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x18c);
          *(uint *)(local_690.ray + 400) =
               (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 400);
          *(uint *)(local_690.ray + 0x194) =
               (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x194);
          *(uint *)(local_690.ray + 0x198) =
               (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x198);
          *(uint *)(local_690.ray + 0x19c) =
               (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x19c);
          iVar102 = *(int *)(local_690.hit + 0x24);
          iVar137 = *(int *)(local_690.hit + 0x28);
          iVar138 = *(int *)(local_690.hit + 0x2c);
          iVar139 = *(int *)(local_690.hit + 0x30);
          iVar140 = *(int *)(local_690.hit + 0x34);
          iVar141 = *(int *)(local_690.hit + 0x38);
          iVar142 = *(int *)(local_690.hit + 0x3c);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar20 = SUB81(uVar89 >> 7,0);
          *(uint *)(local_690.ray + 0x1a0) =
               (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x20) |
               (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x1a0);
          *(uint *)(local_690.ray + 0x1a4) =
               (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x1a4);
          *(uint *)(local_690.ray + 0x1a8) =
               (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x1a8);
          *(uint *)(local_690.ray + 0x1ac) =
               (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x1ac);
          *(uint *)(local_690.ray + 0x1b0) =
               (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x1b0);
          *(uint *)(local_690.ray + 0x1b4) =
               (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x1b4);
          *(uint *)(local_690.ray + 0x1b8) =
               (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x1b8);
          *(uint *)(local_690.ray + 0x1bc) =
               (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x1bc);
          iVar102 = *(int *)(local_690.hit + 0x44);
          iVar137 = *(int *)(local_690.hit + 0x48);
          iVar138 = *(int *)(local_690.hit + 0x4c);
          iVar139 = *(int *)(local_690.hit + 0x50);
          iVar140 = *(int *)(local_690.hit + 0x54);
          iVar141 = *(int *)(local_690.hit + 0x58);
          iVar142 = *(int *)(local_690.hit + 0x5c);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar20 = SUB81(uVar89 >> 7,0);
          *(uint *)(local_690.ray + 0x1c0) =
               (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x40) |
               (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x1c0);
          *(uint *)(local_690.ray + 0x1c4) =
               (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x1c4);
          *(uint *)(local_690.ray + 0x1c8) =
               (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x1c8);
          *(uint *)(local_690.ray + 0x1cc) =
               (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x1cc);
          *(uint *)(local_690.ray + 0x1d0) =
               (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x1d0);
          *(uint *)(local_690.ray + 0x1d4) =
               (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x1d4);
          *(uint *)(local_690.ray + 0x1d8) =
               (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x1d8);
          *(uint *)(local_690.ray + 0x1dc) =
               (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x1dc);
          iVar102 = *(int *)(local_690.hit + 100);
          iVar137 = *(int *)(local_690.hit + 0x68);
          iVar138 = *(int *)(local_690.hit + 0x6c);
          iVar139 = *(int *)(local_690.hit + 0x70);
          iVar140 = *(int *)(local_690.hit + 0x74);
          iVar141 = *(int *)(local_690.hit + 0x78);
          iVar142 = *(int *)(local_690.hit + 0x7c);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar20 = SUB81(uVar89 >> 7,0);
          *(uint *)(local_690.ray + 0x1e0) =
               (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x60) |
               (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x1e0);
          *(uint *)(local_690.ray + 0x1e4) =
               (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x1e4);
          *(uint *)(local_690.ray + 0x1e8) =
               (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x1e8);
          *(uint *)(local_690.ray + 0x1ec) =
               (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x1ec);
          *(uint *)(local_690.ray + 0x1f0) =
               (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x1f0);
          *(uint *)(local_690.ray + 500) =
               (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 500);
          *(uint *)(local_690.ray + 0x1f8) =
               (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x1f8);
          *(uint *)(local_690.ray + 0x1fc) =
               (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x1fc);
          iVar102 = *(int *)(local_690.hit + 0x84);
          iVar137 = *(int *)(local_690.hit + 0x88);
          iVar138 = *(int *)(local_690.hit + 0x8c);
          iVar139 = *(int *)(local_690.hit + 0x90);
          iVar140 = *(int *)(local_690.hit + 0x94);
          iVar141 = *(int *)(local_690.hit + 0x98);
          iVar142 = *(int *)(local_690.hit + 0x9c);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 6) & 1);
          bVar20 = SUB81(uVar89 >> 7,0);
          *(uint *)(local_690.ray + 0x200) =
               (uint)(bVar99 & 1) * *(int *)(local_690.hit + 0x80) |
               (uint)!(bool)(bVar99 & 1) * *(int *)(local_690.ray + 0x200);
          *(uint *)(local_690.ray + 0x204) =
               (uint)bVar14 * iVar102 | (uint)!bVar14 * *(int *)(local_690.ray + 0x204);
          *(uint *)(local_690.ray + 0x208) =
               (uint)bVar15 * iVar137 | (uint)!bVar15 * *(int *)(local_690.ray + 0x208);
          *(uint *)(local_690.ray + 0x20c) =
               (uint)bVar16 * iVar138 | (uint)!bVar16 * *(int *)(local_690.ray + 0x20c);
          *(uint *)(local_690.ray + 0x210) =
               (uint)bVar17 * iVar139 | (uint)!bVar17 * *(int *)(local_690.ray + 0x210);
          *(uint *)(local_690.ray + 0x214) =
               (uint)bVar18 * iVar140 | (uint)!bVar18 * *(int *)(local_690.ray + 0x214);
          *(uint *)(local_690.ray + 0x218) =
               (uint)bVar19 * iVar141 | (uint)!bVar19 * *(int *)(local_690.ray + 0x218);
          *(uint *)(local_690.ray + 0x21c) =
               (uint)bVar20 * iVar142 | (uint)!bVar20 * *(int *)(local_690.ray + 0x21c);
          auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0xa0));
          *(undefined1 (*) [32])(local_690.ray + 0x220) = auVar107;
          auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0xc0));
          *(undefined1 (*) [32])(local_690.ray + 0x240) = auVar107;
          auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0xe0));
          *(undefined1 (*) [32])(local_690.ray + 0x260) = auVar107;
          auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_690.hit + 0x100));
          *(undefined1 (*) [32])(local_690.ray + 0x280) = auVar107;
          auVar183 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        }
        uVar181 = auVar183._0_4_;
        auVar145._4_4_ = uVar181;
        auVar145._0_4_ = uVar181;
        auVar145._8_4_ = uVar181;
        auVar145._12_4_ = uVar181;
        auVar145._16_4_ = uVar181;
        auVar145._20_4_ = uVar181;
        auVar145._24_4_ = uVar181;
        auVar145._28_4_ = uVar181;
        uVar89 = vcmpps_avx512vl(auVar155._0_32_,auVar145,2);
        uVar97 = (byte)(~(byte)(1 << (uVar92 & 0x1f)) & (byte)uVar97) & uVar89;
        uVar100 = uVar101;
      }
      bVar99 = (byte)uVar100;
      auVar107 = auVar159._0_32_;
      auVar108 = auVar165._0_32_;
      auVar158 = auVar189._0_32_;
      auVar116 = auVar178._0_32_;
      auVar115 = auVar197._0_32_;
      auVar114 = auVar196._0_32_;
      auVar109 = auVar167._0_32_;
      auVar111 = auVar195._0_32_;
      auVar118 = auVar199._0_32_;
      auVar117 = auVar198._0_32_;
      auVar156 = auVar188._0_32_;
      auVar127 = auVar187._0_32_;
      auVar120 = auVar201._0_32_;
      auVar119 = auVar200._0_32_;
      auVar110 = auVar194._0_32_;
      auVar106 = auVar193._0_32_;
      auVar104 = auVar192._0_32_;
      auVar160 = auVar190._0_32_;
      auVar112 = auVar185._0_32_;
      auVar113 = auVar186._0_32_;
      auVar134 = auVar184._0_32_;
      bVar90 = (byte)uVar97;
      if (bVar90 == 0) goto LAB_01983ff1;
      auVar107 = vblendmps_avx512vl(auVar191._0_32_,auVar155._0_32_);
      auVar105._0_4_ =
           (uint)(bVar90 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar145._0_4_;
      bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar145._4_4_;
      bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar145._8_4_;
      bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar145._12_4_;
      bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar105._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar145._16_4_;
      bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar105._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar145._20_4_;
      bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar105._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar145._24_4_;
      bVar14 = SUB81(uVar97 >> 7,0);
      auVar105._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * auVar145._28_4_;
      auVar107 = vshufps_avx(auVar105,auVar105,0xb1);
      auVar107 = vminps_avx(auVar105,auVar107);
      auVar108 = vshufpd_avx(auVar107,auVar107,5);
      auVar107 = vminps_avx(auVar107,auVar108);
      auVar108 = vpermpd_avx2(auVar107,0x4e);
      auVar107 = vminps_avx(auVar107,auVar108);
      uVar77 = vcmpps_avx512vl(auVar105,auVar107,0);
      bVar90 = (byte)uVar77 & bVar90;
      uVar93 = (uint)uVar97;
      if (bVar90 != 0) {
        uVar93 = (uint)bVar90;
      }
      uVar92 = 0;
      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
        uVar92 = uVar92 + 1;
      }
      goto LAB_0198397f;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }